

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::sse2::CurveNvIntersector1<4>::
     intersect_t<embree::sse2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  Primitive *pPVar2;
  Primitive *pPVar3;
  Primitive *pPVar4;
  Primitive PVar5;
  Geometry *pGVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined6 uVar30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  int iVar46;
  undefined4 uVar47;
  long lVar48;
  ulong uVar49;
  RayHit *extraout_RAX;
  RayHit *extraout_RAX_00;
  RayHit *extraout_RAX_01;
  RayHit *extraout_RAX_02;
  RayHit *pRVar50;
  undefined4 uVar52;
  RayHit *extraout_RAX_03;
  RayHit *extraout_RAX_04;
  RayHit *extraout_RAX_05;
  RayHit *extraout_RAX_06;
  RayHit *pRVar51;
  RTCIntersectArguments *pRVar53;
  ulong uVar54;
  RTCIntersectArguments *pRVar55;
  ulong uVar56;
  ulong uVar57;
  bool bVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  short sVar68;
  float fVar69;
  float fVar108;
  float fVar109;
  __m128 a_1;
  undefined2 uVar107;
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar110;
  float fVar126;
  float fVar127;
  vfloat4 v;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar128;
  float fVar129;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar143;
  float fVar155;
  float fVar156;
  vfloat4 v_1;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar157;
  float fVar176;
  float fVar177;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar178;
  float fVar188;
  float fVar189;
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar190;
  float fVar197;
  float fVar198;
  undefined1 auVar191 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar199;
  float fVar225;
  float fVar226;
  undefined1 auVar200 [16];
  undefined1 auVar203 [16];
  undefined1 auVar206 [16];
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar227;
  float fVar241;
  float fVar242;
  undefined1 auVar228 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar237 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar243;
  float fVar254;
  float fVar255;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar256;
  float fVar259;
  float fVar260;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar261;
  float fVar266;
  float fVar267;
  float fVar268;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  vfloat4 a;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar286;
  float fVar290;
  float fVar291;
  float fVar292;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  RTCFilterFunctionNArguments args;
  vfloatx vu0;
  vfloatx u_outer1;
  vfloatx u_outer0;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  undefined4 local_58c;
  undefined1 local_588 [16];
  RTCIntersectArguments *local_570;
  undefined1 local_568 [8];
  float fStack_560;
  float fStack_55c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  RTCFilterFunctionNArguments local_4e8;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  ulong local_4a0;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined8 local_458;
  float fStack_450;
  float fStack_44c;
  undefined4 local_448;
  uint local_444;
  uint local_440;
  uint local_43c;
  uint local_438;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  Primitive *local_330;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  float local_2b8 [4];
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  Primitive *local_298;
  ulong local_290;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  uint auStack_f8 [4];
  float afStack_e8 [6];
  float afStack_d0 [40];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 uVar106;
  undefined1 auVar132 [16];
  undefined1 auVar135 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar236 [16];
  undefined1 auVar238 [16];
  
  PVar5 = prim[1];
  uVar54 = (ulong)(byte)PVar5;
  pPVar1 = prim + uVar54 * 0x19 + 6;
  fVar127 = *(float *)(pPVar1 + 0xc);
  fVar143 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar1) * fVar127;
  fVar155 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar1 + 4)) * fVar127;
  fVar156 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar1 + 8)) * fVar127;
  fVar110 = fVar127 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar126 = fVar127 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar127 = fVar127 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar52 = *(undefined4 *)(prim + uVar54 * 4 + 6);
  uVar106 = (undefined1)((uint)uVar52 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar52 >> 0x10);
  uVar16 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar52));
  uVar106 = (undefined1)((uint)uVar52 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar16 >> 0x20),uVar106),uVar106);
  sVar68 = CONCAT11((char)uVar52,(char)uVar52);
  uVar49 = CONCAT62(uVar30,sVar68);
  auVar245._8_4_ = 0;
  auVar245._0_8_ = uVar49;
  auVar245._12_2_ = uVar107;
  auVar245._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar16 >> 0x20);
  auVar219._12_4_ = auVar245._12_4_;
  auVar219._8_2_ = 0;
  auVar219._0_8_ = uVar49;
  auVar219._10_2_ = uVar107;
  auVar264._10_6_ = auVar219._10_6_;
  auVar264._8_2_ = uVar107;
  auVar264._0_8_ = uVar49;
  uVar107 = (undefined2)uVar30;
  auVar31._4_8_ = auVar264._8_8_;
  auVar31._2_2_ = uVar107;
  auVar31._0_2_ = uVar107;
  fVar128 = (float)((int)sVar68 >> 8);
  fVar140 = (float)(auVar31._0_4_ >> 0x18);
  fVar141 = (float)(auVar264._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + uVar54 * 5 + 6);
  uVar106 = (undefined1)((uint)uVar52 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar52 >> 0x10);
  uVar16 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar52));
  uVar106 = (undefined1)((uint)uVar52 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar16 >> 0x20),uVar106),uVar106);
  sVar68 = CONCAT11((char)uVar52,(char)uVar52);
  uVar49 = CONCAT62(uVar30,sVar68);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar49;
  auVar72._12_2_ = uVar107;
  auVar72._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar16 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar49;
  auVar71._10_2_ = uVar107;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar107;
  auVar70._0_8_ = uVar49;
  uVar107 = (undefined2)uVar30;
  auVar32._4_8_ = auVar70._8_8_;
  auVar32._2_2_ = uVar107;
  auVar32._0_2_ = uVar107;
  fVar157 = (float)((int)sVar68 >> 8);
  fVar176 = (float)(auVar32._0_4_ >> 0x18);
  fVar177 = (float)(auVar70._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + uVar54 * 6 + 6);
  uVar106 = (undefined1)((uint)uVar52 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar52 >> 0x10);
  uVar16 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar52));
  uVar106 = (undefined1)((uint)uVar52 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar16 >> 0x20),uVar106),uVar106);
  sVar68 = CONCAT11((char)uVar52,(char)uVar52);
  uVar49 = CONCAT62(uVar30,sVar68);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar49;
  auVar75._12_2_ = uVar107;
  auVar75._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar16 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar49;
  auVar74._10_2_ = uVar107;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar107;
  auVar73._0_8_ = uVar49;
  uVar107 = (undefined2)uVar30;
  auVar33._4_8_ = auVar73._8_8_;
  auVar33._2_2_ = uVar107;
  auVar33._0_2_ = uVar107;
  fVar178 = (float)((int)sVar68 >> 8);
  fVar188 = (float)(auVar33._0_4_ >> 0x18);
  fVar189 = (float)(auVar73._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + uVar54 * 0xb + 6);
  uVar106 = (undefined1)((uint)uVar52 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar52 >> 0x10);
  uVar16 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar52));
  uVar106 = (undefined1)((uint)uVar52 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar16 >> 0x20),uVar106),uVar106);
  sVar68 = CONCAT11((char)uVar52,(char)uVar52);
  uVar49 = CONCAT62(uVar30,sVar68);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar49;
  auVar78._12_2_ = uVar107;
  auVar78._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar16 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar49;
  auVar77._10_2_ = uVar107;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar107;
  auVar76._0_8_ = uVar49;
  uVar107 = (undefined2)uVar30;
  auVar34._4_8_ = auVar76._8_8_;
  auVar34._2_2_ = uVar107;
  auVar34._0_2_ = uVar107;
  fVar69 = (float)((int)sVar68 >> 8);
  fVar108 = (float)(auVar34._0_4_ >> 0x18);
  fVar109 = (float)(auVar76._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  uVar106 = (undefined1)((uint)uVar52 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar52 >> 0x10);
  uVar16 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar52));
  uVar106 = (undefined1)((uint)uVar52 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar16 >> 0x20),uVar106),uVar106);
  sVar68 = CONCAT11((char)uVar52,(char)uVar52);
  uVar49 = CONCAT62(uVar30,sVar68);
  auVar193._8_4_ = 0;
  auVar193._0_8_ = uVar49;
  auVar193._12_2_ = uVar107;
  auVar193._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar16 >> 0x20);
  auVar192._12_4_ = auVar193._12_4_;
  auVar192._8_2_ = 0;
  auVar192._0_8_ = uVar49;
  auVar192._10_2_ = uVar107;
  auVar191._10_6_ = auVar192._10_6_;
  auVar191._8_2_ = uVar107;
  auVar191._0_8_ = uVar49;
  uVar107 = (undefined2)uVar30;
  auVar35._4_8_ = auVar191._8_8_;
  auVar35._2_2_ = uVar107;
  auVar35._0_2_ = uVar107;
  fVar190 = (float)((int)sVar68 >> 8);
  fVar197 = (float)(auVar35._0_4_ >> 0x18);
  fVar198 = (float)(auVar191._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + (uint)(byte)PVar5 * 0xc + uVar54 + 6);
  uVar106 = (undefined1)((uint)uVar52 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar52 >> 0x10);
  uVar16 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar52));
  uVar106 = (undefined1)((uint)uVar52 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar16 >> 0x20),uVar106),uVar106);
  sVar68 = CONCAT11((char)uVar52,(char)uVar52);
  uVar49 = CONCAT62(uVar30,sVar68);
  auVar202._8_4_ = 0;
  auVar202._0_8_ = uVar49;
  auVar202._12_2_ = uVar107;
  auVar202._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar16 >> 0x20);
  auVar201._12_4_ = auVar202._12_4_;
  auVar201._8_2_ = 0;
  auVar201._0_8_ = uVar49;
  auVar201._10_2_ = uVar107;
  auVar200._10_6_ = auVar201._10_6_;
  auVar200._8_2_ = uVar107;
  auVar200._0_8_ = uVar49;
  uVar107 = (undefined2)uVar30;
  auVar36._4_8_ = auVar200._8_8_;
  auVar36._2_2_ = uVar107;
  auVar36._0_2_ = uVar107;
  fVar243 = (float)((int)sVar68 >> 8);
  fVar254 = (float)(auVar36._0_4_ >> 0x18);
  fVar255 = (float)(auVar200._8_4_ >> 0x18);
  uVar56 = (ulong)(uint)((int)(uVar54 * 9) * 2);
  uVar52 = *(undefined4 *)(prim + uVar56 + 6);
  uVar106 = (undefined1)((uint)uVar52 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar52 >> 0x10);
  uVar16 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar52));
  uVar106 = (undefined1)((uint)uVar52 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar16 >> 0x20),uVar106),uVar106);
  sVar68 = CONCAT11((char)uVar52,(char)uVar52);
  uVar49 = CONCAT62(uVar30,sVar68);
  auVar205._8_4_ = 0;
  auVar205._0_8_ = uVar49;
  auVar205._12_2_ = uVar107;
  auVar205._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar16 >> 0x20);
  auVar204._12_4_ = auVar205._12_4_;
  auVar204._8_2_ = 0;
  auVar204._0_8_ = uVar49;
  auVar204._10_2_ = uVar107;
  auVar203._10_6_ = auVar204._10_6_;
  auVar203._8_2_ = uVar107;
  auVar203._0_8_ = uVar49;
  uVar107 = (undefined2)uVar30;
  auVar37._4_8_ = auVar203._8_8_;
  auVar37._2_2_ = uVar107;
  auVar37._0_2_ = uVar107;
  fVar227 = (float)((int)sVar68 >> 8);
  fVar241 = (float)(auVar37._0_4_ >> 0x18);
  fVar242 = (float)(auVar203._8_4_ >> 0x18);
  uVar52 = *(undefined4 *)(prim + uVar56 + uVar54 + 6);
  uVar106 = (undefined1)((uint)uVar52 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar52 >> 0x10);
  uVar16 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar52));
  uVar106 = (undefined1)((uint)uVar52 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar16 >> 0x20),uVar106),uVar106);
  sVar68 = CONCAT11((char)uVar52,(char)uVar52);
  uVar49 = CONCAT62(uVar30,sVar68);
  auVar208._8_4_ = 0;
  auVar208._0_8_ = uVar49;
  auVar208._12_2_ = uVar107;
  auVar208._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar16 >> 0x20);
  auVar207._12_4_ = auVar208._12_4_;
  auVar207._8_2_ = 0;
  auVar207._0_8_ = uVar49;
  auVar207._10_2_ = uVar107;
  auVar206._10_6_ = auVar207._10_6_;
  auVar206._8_2_ = uVar107;
  auVar206._0_8_ = uVar49;
  uVar107 = (undefined2)uVar30;
  auVar38._4_8_ = auVar206._8_8_;
  auVar38._2_2_ = uVar107;
  auVar38._0_2_ = uVar107;
  fVar256 = (float)((int)sVar68 >> 8);
  fVar259 = (float)(auVar38._0_4_ >> 0x18);
  fVar260 = (float)(auVar206._8_4_ >> 0x18);
  uVar57 = (ulong)(uint)((int)(uVar54 * 5) << 2);
  uVar52 = *(undefined4 *)(prim + uVar57 + 6);
  uVar106 = (undefined1)((uint)uVar52 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar52 >> 0x10);
  uVar16 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar52));
  uVar106 = (undefined1)((uint)uVar52 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar16 >> 0x20),uVar106),uVar106);
  sVar68 = CONCAT11((char)uVar52,(char)uVar52);
  uVar49 = CONCAT62(uVar30,sVar68);
  auVar211._8_4_ = 0;
  auVar211._0_8_ = uVar49;
  auVar211._12_2_ = uVar107;
  auVar211._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar16 >> 0x20);
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._8_2_ = 0;
  auVar210._0_8_ = uVar49;
  auVar210._10_2_ = uVar107;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._8_2_ = uVar107;
  auVar209._0_8_ = uVar49;
  uVar107 = (undefined2)uVar30;
  auVar39._4_8_ = auVar209._8_8_;
  auVar39._2_2_ = uVar107;
  auVar39._0_2_ = uVar107;
  fVar277 = (float)((int)sVar68 >> 8);
  fVar281 = (float)(auVar39._0_4_ >> 0x18);
  fVar283 = (float)(auVar209._8_4_ >> 0x18);
  fVar269 = fVar110 * fVar128 + fVar126 * fVar157 + fVar127 * fVar178;
  fVar271 = fVar110 * fVar140 + fVar126 * fVar176 + fVar127 * fVar188;
  fVar273 = fVar110 * fVar141 + fVar126 * fVar177 + fVar127 * fVar189;
  fVar275 = fVar110 * (float)(auVar219._12_4_ >> 0x18) +
            fVar126 * (float)(auVar71._12_4_ >> 0x18) + fVar127 * (float)(auVar74._12_4_ >> 0x18);
  fVar261 = fVar110 * fVar69 + fVar126 * fVar190 + fVar127 * fVar243;
  fVar266 = fVar110 * fVar108 + fVar126 * fVar197 + fVar127 * fVar254;
  fVar267 = fVar110 * fVar109 + fVar126 * fVar198 + fVar127 * fVar255;
  fVar268 = fVar110 * (float)(auVar77._12_4_ >> 0x18) +
            fVar126 * (float)(auVar192._12_4_ >> 0x18) + fVar127 * (float)(auVar201._12_4_ >> 0x18);
  fVar199 = fVar110 * fVar227 + fVar126 * fVar256 + fVar127 * fVar277;
  fVar225 = fVar110 * fVar241 + fVar126 * fVar259 + fVar127 * fVar281;
  fVar226 = fVar110 * fVar242 + fVar126 * fVar260 + fVar127 * fVar283;
  fVar110 = fVar110 * (float)(auVar204._12_4_ >> 0x18) +
            fVar126 * (float)(auVar207._12_4_ >> 0x18) + fVar127 * (float)(auVar210._12_4_ >> 0x18);
  fVar129 = fVar128 * fVar143 + fVar157 * fVar155 + fVar178 * fVar156;
  fVar188 = fVar140 * fVar143 + fVar176 * fVar155 + fVar188 * fVar156;
  fVar189 = fVar141 * fVar143 + fVar177 * fVar155 + fVar189 * fVar156;
  fVar142 = (float)(auVar219._12_4_ >> 0x18) * fVar143 +
            (float)(auVar71._12_4_ >> 0x18) * fVar155 + (float)(auVar74._12_4_ >> 0x18) * fVar156;
  fVar190 = fVar69 * fVar143 + fVar190 * fVar155 + fVar243 * fVar156;
  fVar197 = fVar108 * fVar143 + fVar197 * fVar155 + fVar254 * fVar156;
  fVar198 = fVar109 * fVar143 + fVar198 * fVar155 + fVar255 * fVar156;
  fVar243 = (float)(auVar77._12_4_ >> 0x18) * fVar143 +
            (float)(auVar192._12_4_ >> 0x18) * fVar155 + (float)(auVar201._12_4_ >> 0x18) * fVar156;
  fVar157 = fVar143 * fVar227 + fVar155 * fVar256 + fVar156 * fVar277;
  fVar176 = fVar143 * fVar241 + fVar155 * fVar259 + fVar156 * fVar281;
  fVar177 = fVar143 * fVar242 + fVar155 * fVar260 + fVar156 * fVar283;
  fVar178 = fVar143 * (float)(auVar204._12_4_ >> 0x18) +
            fVar155 * (float)(auVar207._12_4_ >> 0x18) + fVar156 * (float)(auVar210._12_4_ >> 0x18);
  fVar127 = (float)DAT_01ff1d40;
  fVar69 = DAT_01ff1d40._4_4_;
  fVar108 = DAT_01ff1d40._8_4_;
  fVar109 = DAT_01ff1d40._12_4_;
  uVar59 = -(uint)(fVar127 <= ABS(fVar269));
  uVar61 = -(uint)(fVar69 <= ABS(fVar271));
  uVar63 = -(uint)(fVar108 <= ABS(fVar273));
  uVar65 = -(uint)(fVar109 <= ABS(fVar275));
  auVar144._0_4_ = ~uVar59 & (uint)fVar127;
  auVar144._4_4_ = ~uVar61 & (uint)fVar69;
  auVar144._8_4_ = ~uVar63 & (uint)fVar108;
  auVar144._12_4_ = ~uVar65 & (uint)fVar109;
  auVar79._4_4_ = (uint)fVar271 & uVar61;
  auVar79._0_4_ = (uint)fVar269 & uVar59;
  auVar79._8_4_ = (uint)fVar273 & uVar63;
  auVar79._12_4_ = (uint)fVar275 & uVar65;
  auVar144 = auVar144 | auVar79;
  uVar59 = -(uint)(fVar127 <= ABS(fVar261));
  uVar61 = -(uint)(fVar69 <= ABS(fVar266));
  uVar63 = -(uint)(fVar108 <= ABS(fVar267));
  uVar65 = -(uint)(fVar109 <= ABS(fVar268));
  auVar262._0_4_ = (uint)fVar261 & uVar59;
  auVar262._4_4_ = (uint)fVar266 & uVar61;
  auVar262._8_4_ = (uint)fVar267 & uVar63;
  auVar262._12_4_ = (uint)fVar268 & uVar65;
  auVar158._0_4_ = ~uVar59 & (uint)fVar127;
  auVar158._4_4_ = ~uVar61 & (uint)fVar69;
  auVar158._8_4_ = ~uVar63 & (uint)fVar108;
  auVar158._12_4_ = ~uVar65 & (uint)fVar109;
  auVar158 = auVar158 | auVar262;
  uVar59 = -(uint)(fVar127 <= ABS(fVar199));
  uVar61 = -(uint)(fVar69 <= ABS(fVar225));
  uVar63 = -(uint)(fVar108 <= ABS(fVar226));
  uVar65 = -(uint)(fVar109 <= ABS(fVar110));
  auVar212._0_4_ = (uint)fVar199 & uVar59;
  auVar212._4_4_ = (uint)fVar225 & uVar61;
  auVar212._8_4_ = (uint)fVar226 & uVar63;
  auVar212._12_4_ = (uint)fVar110 & uVar65;
  auVar194._0_4_ = ~uVar59 & (uint)fVar127;
  auVar194._4_4_ = ~uVar61 & (uint)fVar69;
  auVar194._8_4_ = ~uVar63 & (uint)fVar108;
  auVar194._12_4_ = ~uVar65 & (uint)fVar109;
  auVar194 = auVar194 | auVar212;
  auVar79 = rcpps(_DAT_01ff1d40,auVar144);
  fVar127 = auVar79._0_4_;
  fVar109 = auVar79._4_4_;
  fVar128 = auVar79._8_4_;
  fVar143 = auVar79._12_4_;
  fVar127 = (1.0 - auVar144._0_4_ * fVar127) * fVar127 + fVar127;
  fVar109 = (1.0 - auVar144._4_4_ * fVar109) * fVar109 + fVar109;
  fVar128 = (1.0 - auVar144._8_4_ * fVar128) * fVar128 + fVar128;
  fVar143 = (1.0 - auVar144._12_4_ * fVar143) * fVar143 + fVar143;
  auVar79 = rcpps(auVar79,auVar158);
  fVar69 = auVar79._0_4_;
  fVar110 = auVar79._4_4_;
  fVar140 = auVar79._8_4_;
  fVar155 = auVar79._12_4_;
  fVar69 = (1.0 - auVar158._0_4_ * fVar69) * fVar69 + fVar69;
  fVar110 = (1.0 - auVar158._4_4_ * fVar110) * fVar110 + fVar110;
  fVar140 = (1.0 - auVar158._8_4_ * fVar140) * fVar140 + fVar140;
  fVar155 = (1.0 - auVar158._12_4_ * fVar155) * fVar155 + fVar155;
  auVar79 = rcpps(auVar79,auVar194);
  fVar108 = auVar79._0_4_;
  fVar126 = auVar79._4_4_;
  fVar141 = auVar79._8_4_;
  fVar156 = auVar79._12_4_;
  fVar108 = (1.0 - auVar194._0_4_ * fVar108) * fVar108 + fVar108;
  fVar126 = (1.0 - auVar194._4_4_ * fVar126) * fVar126 + fVar126;
  fVar141 = (1.0 - auVar194._8_4_ * fVar141) * fVar141 + fVar141;
  fVar156 = (1.0 - auVar194._12_4_ * fVar156) * fVar156 + fVar156;
  uVar49 = *(ulong *)(prim + uVar54 * 7 + 6);
  uVar107 = (undefined2)(uVar49 >> 0x30);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar49;
  auVar82._12_2_ = uVar107;
  auVar82._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar49 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar49;
  auVar81._10_2_ = uVar107;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar107;
  auVar80._0_8_ = uVar49;
  uVar107 = (undefined2)(uVar49 >> 0x10);
  auVar40._4_8_ = auVar80._8_8_;
  auVar40._2_2_ = uVar107;
  auVar40._0_2_ = uVar107;
  auVar145._0_8_ =
       CONCAT44(((float)(auVar40._0_4_ >> 0x10) - fVar188) * fVar109,
                ((float)(int)(short)uVar49 - fVar129) * fVar127);
  auVar145._8_4_ = ((float)(auVar80._8_4_ >> 0x10) - fVar189) * fVar128;
  auVar145._12_4_ = ((float)(auVar81._12_4_ >> 0x10) - fVar142) * fVar143;
  uVar49 = *(ulong *)(prim + uVar54 * 9 + 6);
  uVar107 = (undefined2)(uVar49 >> 0x30);
  auVar85._8_4_ = 0;
  auVar85._0_8_ = uVar49;
  auVar85._12_2_ = uVar107;
  auVar85._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar49 >> 0x20);
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar49;
  auVar84._10_2_ = uVar107;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._8_2_ = uVar107;
  auVar83._0_8_ = uVar49;
  uVar107 = (undefined2)(uVar49 >> 0x10);
  auVar41._4_8_ = auVar83._8_8_;
  auVar41._2_2_ = uVar107;
  auVar41._0_2_ = uVar107;
  auVar195._0_4_ = ((float)(int)(short)uVar49 - fVar129) * fVar127;
  auVar195._4_4_ = ((float)(auVar41._0_4_ >> 0x10) - fVar188) * fVar109;
  auVar195._8_4_ = ((float)(auVar83._8_4_ >> 0x10) - fVar189) * fVar128;
  auVar195._12_4_ = ((float)(auVar84._12_4_ >> 0x10) - fVar142) * fVar143;
  uVar49 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar56 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar54 * -2 + 6);
  uVar107 = (undefined2)(uVar56 >> 0x30);
  auVar215._8_4_ = 0;
  auVar215._0_8_ = uVar56;
  auVar215._12_2_ = uVar107;
  auVar215._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar56 >> 0x20);
  auVar214._12_4_ = auVar215._12_4_;
  auVar214._8_2_ = 0;
  auVar214._0_8_ = uVar56;
  auVar214._10_2_ = uVar107;
  auVar213._10_6_ = auVar214._10_6_;
  auVar213._8_2_ = uVar107;
  auVar213._0_8_ = uVar56;
  uVar107 = (undefined2)(uVar56 >> 0x10);
  auVar42._4_8_ = auVar213._8_8_;
  auVar42._2_2_ = uVar107;
  auVar42._0_2_ = uVar107;
  auVar216._0_8_ =
       CONCAT44(((float)(auVar42._0_4_ >> 0x10) - fVar197) * fVar110,
                ((float)(int)(short)uVar56 - fVar190) * fVar69);
  auVar216._8_4_ = ((float)(auVar213._8_4_ >> 0x10) - fVar198) * fVar140;
  auVar216._12_4_ = ((float)(auVar214._12_4_ >> 0x10) - fVar243) * fVar155;
  uVar107 = (undefined2)(uVar49 >> 0x30);
  auVar88._8_4_ = 0;
  auVar88._0_8_ = uVar49;
  auVar88._12_2_ = uVar107;
  auVar88._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar49 >> 0x20);
  auVar87._12_4_ = auVar88._12_4_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar49;
  auVar87._10_2_ = uVar107;
  auVar86._10_6_ = auVar87._10_6_;
  auVar86._8_2_ = uVar107;
  auVar86._0_8_ = uVar49;
  uVar107 = (undefined2)(uVar49 >> 0x10);
  auVar43._4_8_ = auVar86._8_8_;
  auVar43._2_2_ = uVar107;
  auVar43._0_2_ = uVar107;
  auVar89._0_4_ = ((float)(int)(short)uVar49 - fVar190) * fVar69;
  auVar89._4_4_ = ((float)(auVar43._0_4_ >> 0x10) - fVar197) * fVar110;
  auVar89._8_4_ = ((float)(auVar86._8_4_ >> 0x10) - fVar198) * fVar140;
  auVar89._12_4_ = ((float)(auVar87._12_4_ >> 0x10) - fVar243) * fVar155;
  uVar49 = *(ulong *)(prim + uVar57 + uVar54 + 6);
  uVar107 = (undefined2)(uVar49 >> 0x30);
  auVar181._8_4_ = 0;
  auVar181._0_8_ = uVar49;
  auVar181._12_2_ = uVar107;
  auVar181._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar49 >> 0x20);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar49;
  auVar180._10_2_ = uVar107;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = uVar107;
  auVar179._0_8_ = uVar49;
  uVar107 = (undefined2)(uVar49 >> 0x10);
  auVar44._4_8_ = auVar179._8_8_;
  auVar44._2_2_ = uVar107;
  auVar44._0_2_ = uVar107;
  auVar182._0_8_ =
       CONCAT44(((float)(auVar44._0_4_ >> 0x10) - fVar176) * fVar126,
                ((float)(int)(short)uVar49 - fVar157) * fVar108);
  auVar182._8_4_ = ((float)(auVar179._8_4_ >> 0x10) - fVar177) * fVar141;
  auVar182._12_4_ = ((float)(auVar180._12_4_ >> 0x10) - fVar178) * fVar156;
  local_330 = prim;
  uVar49 = *(ulong *)(prim + uVar54 * 0x17 + 6);
  uVar107 = (undefined2)(uVar49 >> 0x30);
  auVar230._8_4_ = 0;
  auVar230._0_8_ = uVar49;
  auVar230._12_2_ = uVar107;
  auVar230._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar49 >> 0x20);
  auVar229._12_4_ = auVar230._12_4_;
  auVar229._8_2_ = 0;
  auVar229._0_8_ = uVar49;
  auVar229._10_2_ = uVar107;
  auVar228._10_6_ = auVar229._10_6_;
  auVar228._8_2_ = uVar107;
  auVar228._0_8_ = uVar49;
  uVar107 = (undefined2)(uVar49 >> 0x10);
  auVar45._4_8_ = auVar228._8_8_;
  auVar45._2_2_ = uVar107;
  auVar45._0_2_ = uVar107;
  auVar231._0_4_ = ((float)(int)(short)uVar49 - fVar157) * fVar108;
  auVar231._4_4_ = ((float)(auVar45._0_4_ >> 0x10) - fVar176) * fVar126;
  auVar231._8_4_ = ((float)(auVar228._8_4_ >> 0x10) - fVar177) * fVar141;
  auVar231._12_4_ = ((float)(auVar229._12_4_ >> 0x10) - fVar178) * fVar156;
  auVar244._8_4_ = auVar145._8_4_;
  auVar244._0_8_ = auVar145._0_8_;
  auVar244._12_4_ = auVar145._12_4_;
  auVar245 = minps(auVar244,auVar195);
  auVar111._8_4_ = auVar216._8_4_;
  auVar111._0_8_ = auVar216._0_8_;
  auVar111._12_4_ = auVar216._12_4_;
  auVar79 = minps(auVar111,auVar89);
  auVar245 = maxps(auVar245,auVar79);
  auVar112._8_4_ = auVar182._8_4_;
  auVar112._0_8_ = auVar182._0_8_;
  auVar112._12_4_ = auVar182._12_4_;
  auVar79 = minps(auVar112,auVar231);
  uVar52 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar159._4_4_ = uVar52;
  auVar159._0_4_ = uVar52;
  auVar159._8_4_ = uVar52;
  auVar159._12_4_ = uVar52;
  auVar79 = maxps(auVar79,auVar159);
  auVar79 = maxps(auVar245,auVar79);
  local_238 = auVar79._0_4_ * 0.99999964;
  fStack_234 = auVar79._4_4_ * 0.99999964;
  fStack_230 = auVar79._8_4_ * 0.99999964;
  fStack_22c = auVar79._12_4_ * 0.99999964;
  auVar79 = maxps(auVar145,auVar195);
  auVar245 = maxps(auVar216,auVar89);
  auVar79 = minps(auVar79,auVar245);
  auVar245 = maxps(auVar182,auVar231);
  fVar127 = (ray->super_RayK<1>).tfar;
  auVar90._4_4_ = fVar127;
  auVar90._0_4_ = fVar127;
  auVar90._8_4_ = fVar127;
  auVar90._12_4_ = fVar127;
  auVar245 = minps(auVar245,auVar90);
  auVar79 = minps(auVar79,auVar245);
  auVar113._0_4_ = -(uint)(PVar5 != (Primitive)0x0 && local_238 <= auVar79._0_4_ * 1.0000004);
  auVar113._4_4_ = -(uint)(1 < (byte)PVar5 && fStack_234 <= auVar79._4_4_ * 1.0000004);
  auVar113._8_4_ = -(uint)(2 < (byte)PVar5 && fStack_230 <= auVar79._8_4_ * 1.0000004);
  auVar113._12_4_ = -(uint)(3 < (byte)PVar5 && fStack_22c <= auVar79._12_4_ * 1.0000004);
  uVar59 = movmskps((int)prim,auVar113);
  if (uVar59 == 0) {
    return;
  }
  uVar59 = uVar59 & 0xff;
  local_218._0_12_ = mm_lookupmask_ps._240_12_;
  local_218._12_4_ = 0;
  local_298 = prim + uVar54 * 0x19 + 0x16;
LAB_00af88d0:
  local_290 = (ulong)uVar59;
  lVar48 = 0;
  if (local_290 != 0) {
    for (; (uVar59 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
    }
  }
  local_290 = local_290 - 1 & local_290;
  uVar59 = *(uint *)(local_330 + lVar48 * 4 + 6);
  lVar48 = lVar48 * 0x40;
  lVar7 = 0;
  if (local_290 != 0) {
    for (; (local_290 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
    }
  }
  pRVar55 = (RTCIntersectArguments *)(ulong)*(uint *)(local_330 + 2);
  pPVar1 = local_298 + lVar48;
  pRVar53 = (RTCIntersectArguments *)(local_290 - 1);
  if ((local_290 != 0) &&
     (pRVar53 = (RTCIntersectArguments *)((ulong)pRVar53 & local_290),
     pRVar53 != (RTCIntersectArguments *)0x0)) {
    lVar7 = 0;
    if (pRVar53 != (RTCIntersectArguments *)0x0) {
      for (; ((ulong)pRVar53 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
      }
    }
    pRVar53 = (RTCIntersectArguments *)(lVar7 << 6);
  }
  pPVar2 = local_298 + lVar48 + 0x10;
  pPVar3 = local_298 + lVar48 + 0x20;
  pPVar4 = local_298 + lVar48 + 0x30;
  local_488 = (ray->super_RayK<1>).org.field_0.m128[0];
  fStack_484 = (ray->super_RayK<1>).org.field_0.m128[1];
  fStack_480 = (ray->super_RayK<1>).org.field_0.m128[2];
  local_318 = (ray->super_RayK<1>).dir.field_0.m128[0];
  local_3e8 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_3d8 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar127 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fStack_11c = local_318 * local_318;
  fVar108 = local_3e8 * local_3e8;
  fVar109 = local_3d8 * local_3d8;
  fVar127 = fVar127 * fVar127;
  fVar69 = fStack_11c + fVar108 + fVar109;
  auVar160._0_8_ = CONCAT44(fVar108 + fVar108 + fVar127,fVar69);
  auVar160._8_4_ = fVar109 + fVar108 + fVar109;
  auVar160._12_4_ = fVar127 + fVar108 + fVar127;
  auVar146._8_4_ = auVar160._8_4_;
  auVar146._0_8_ = auVar160._0_8_;
  auVar146._12_4_ = auVar160._12_4_;
  auVar79 = rcpss(auVar146,auVar160);
  local_3a8 = (2.0 - fVar69 * auVar79._0_4_) * auVar79._0_4_ *
              (((*(float *)(pPVar1 + 8) + *(float *)(pPVar2 + 8) + *(float *)(pPVar3 + 8) +
                *(float *)(pPVar4 + 8)) * 0.25 - fStack_480) * local_3d8 +
              ((*(float *)(pPVar1 + 4) + *(float *)(pPVar2 + 4) + *(float *)(pPVar3 + 4) +
               *(float *)(pPVar4 + 4)) * 0.25 - fStack_484) * local_3e8 +
              ((*(float *)pPVar1 + *(float *)pPVar2 + *(float *)pPVar3 + *(float *)pPVar4) * 0.25 -
              local_488) * local_318);
  local_2c8 = ZEXT416((uint)local_3a8);
  fStack_3a4 = local_3a8;
  fStack_3a0 = local_3a8;
  fStack_39c = local_3a8;
  local_488 = local_318 * local_3a8 + local_488;
  fStack_484 = local_3e8 * local_3a8 + fStack_484;
  fStack_480 = local_3d8 * local_3a8 + fStack_480;
  local_4f8 = *(float *)pPVar1 - local_488;
  fStack_4f4 = *(float *)(pPVar1 + 4) - fStack_484;
  fStack_4f0 = *(float *)(pPVar1 + 8) - fStack_480;
  fStack_4ec = *(float *)(pPVar1 + 0xc) - 0.0;
  local_478 = *(float *)pPVar3 - local_488;
  fStack_474 = *(float *)(pPVar3 + 4) - fStack_484;
  fStack_470 = *(float *)(pPVar3 + 8) - fStack_480;
  fStack_46c = *(float *)(pPVar3 + 0xc) - 0.0;
  local_468 = *(float *)pPVar2 - local_488;
  fStack_464 = *(float *)(pPVar2 + 4) - fStack_484;
  fStack_460 = *(float *)(pPVar2 + 8) - fStack_480;
  fStack_45c = *(float *)(pPVar2 + 0xc) - 0.0;
  local_488 = *(float *)pPVar4 - local_488;
  fStack_484 = *(float *)(pPVar4 + 4) - fStack_484;
  fStack_480 = *(float *)(pPVar4 + 8) - fStack_480;
  fStack_47c = *(float *)(pPVar4 + 0xc) - 0.0;
  local_138 = local_4f8;
  fStack_134 = local_4f8;
  fStack_130 = local_4f8;
  fStack_12c = local_4f8;
  local_148 = fStack_4f4;
  fStack_144 = fStack_4f4;
  fStack_140 = fStack_4f4;
  fStack_13c = fStack_4f4;
  local_158 = fStack_4f0;
  fStack_154 = fStack_4f0;
  fStack_150 = fStack_4f0;
  fStack_14c = fStack_4f0;
  local_168 = fStack_4ec;
  fStack_164 = fStack_4ec;
  fStack_160 = fStack_4ec;
  fStack_15c = fStack_4ec;
  local_178 = local_468;
  fStack_174 = local_468;
  fStack_170 = local_468;
  fStack_16c = local_468;
  local_188 = fStack_464;
  fStack_184 = fStack_464;
  fStack_180 = fStack_464;
  fStack_17c = fStack_464;
  local_198 = fStack_460;
  fStack_194 = fStack_460;
  fStack_190 = fStack_460;
  fStack_18c = fStack_460;
  local_1a8 = fStack_45c;
  fStack_1a4 = fStack_45c;
  fStack_1a0 = fStack_45c;
  fStack_19c = fStack_45c;
  local_128 = fStack_11c + fVar109 + fVar108;
  fStack_124 = fStack_11c + fVar109 + fVar108;
  fStack_120 = fStack_11c + fVar109 + fVar108;
  fStack_11c = fStack_11c + fVar109 + fVar108;
  local_1b8 = local_478;
  fStack_1b4 = local_478;
  fStack_1b0 = local_478;
  fStack_1ac = local_478;
  local_1c8 = fStack_474;
  fStack_1c4 = fStack_474;
  fStack_1c0 = fStack_474;
  fStack_1bc = fStack_474;
  local_268 = fStack_470;
  fStack_264 = fStack_470;
  fStack_260 = fStack_470;
  fStack_25c = fStack_470;
  local_278 = fStack_46c;
  fStack_274 = fStack_46c;
  fStack_270 = fStack_46c;
  fStack_26c = fStack_46c;
  local_1d8 = local_488;
  fStack_1d4 = local_488;
  fStack_1d0 = local_488;
  fStack_1cc = local_488;
  local_1e8 = fStack_484;
  fStack_1e4 = fStack_484;
  fStack_1e0 = fStack_484;
  fStack_1dc = fStack_484;
  local_1f8 = fStack_480;
  fStack_1f4 = fStack_480;
  fStack_1f0 = fStack_480;
  fStack_1ec = fStack_480;
  local_208 = fStack_47c;
  fStack_204 = fStack_47c;
  fStack_200 = fStack_47c;
  fStack_1fc = fStack_47c;
  fStack_314 = local_318;
  fStack_310 = local_318;
  fStack_30c = local_318;
  fStack_3e4 = local_3e8;
  fStack_3e0 = local_3e8;
  fStack_3dc = local_3e8;
  fStack_3d4 = local_3d8;
  fStack_3d0 = local_3d8;
  fStack_3cc = local_3d8;
  local_288 = ABS(local_128);
  fStack_284 = ABS(fStack_124);
  fStack_280 = ABS(fStack_120);
  fStack_27c = ABS(fStack_11c);
  uVar49 = 1;
  local_4a0 = 1;
  local_3f8 = 0.0;
  fStack_3f4 = 1.0;
  uStack_3f0 = 0;
  uStack_3ec = 0;
  uVar56 = 0;
  local_570 = pRVar55;
  do {
    local_368 = fStack_3f4 - local_3f8;
    fStack_364 = local_368;
    fStack_360 = local_368;
    fStack_35c = local_368;
    local_378 = local_3f8;
    fStack_374 = local_3f8;
    fStack_370 = local_3f8;
    fStack_36c = local_3f8;
    fVar69 = local_368 * 0.0 + local_3f8;
    fVar108 = local_368 * 0.33333334 + local_3f8;
    fVar109 = local_368 * 0.6666667 + local_3f8;
    fVar110 = local_368 * 1.0 + local_3f8;
    fVar243 = (float)DAT_01feca10;
    fVar254 = fVar243 - fVar69;
    fVar255 = DAT_01feca10._4_4_;
    fVar256 = fVar255 - fVar108;
    fVar259 = DAT_01feca10._8_4_;
    fVar266 = DAT_01feca10._12_4_;
    fVar260 = fVar259 - fVar109;
    fVar261 = fVar266 - fVar110;
    fVar126 = local_178 * fVar254 + local_1b8 * fVar69;
    fVar268 = fStack_174 * fVar256 + fStack_1b4 * fVar108;
    fVar269 = fStack_170 * fVar260 + fStack_1b0 * fVar109;
    fVar271 = fStack_16c * fVar261 + fStack_1ac * fVar110;
    fVar273 = local_188 * fVar254 + local_1c8 * fVar69;
    fVar275 = fStack_184 * fVar256 + fStack_1c4 * fVar108;
    fVar277 = fStack_180 * fVar260 + fStack_1c0 * fVar109;
    fVar281 = fStack_17c * fVar261 + fStack_1bc * fVar110;
    fVar127 = local_198 * fVar254 + local_268 * fVar69;
    fVar128 = fStack_194 * fVar256 + fStack_264 * fVar108;
    fVar140 = fStack_190 * fVar260 + fStack_260 * fVar109;
    fVar141 = fStack_18c * fVar261 + fStack_25c * fVar110;
    fVar226 = local_1a8 * fVar254 + local_278 * fVar69;
    fVar227 = fStack_1a4 * fVar256 + fStack_274 * fVar108;
    fVar241 = fStack_1a0 * fVar260 + fStack_270 * fVar109;
    fVar242 = fStack_19c * fVar261 + fStack_26c * fVar110;
    fVar143 = (local_138 * fVar254 + local_178 * fVar69) * fVar254 + fVar69 * fVar126;
    fVar155 = (fStack_134 * fVar256 + fStack_174 * fVar108) * fVar256 + fVar108 * fVar268;
    fVar156 = (fStack_130 * fVar260 + fStack_170 * fVar109) * fVar260 + fVar109 * fVar269;
    fVar157 = (fStack_12c * fVar261 + fStack_16c * fVar110) * fVar261 + fVar110 * fVar271;
    fVar176 = (local_148 * fVar254 + local_188 * fVar69) * fVar254 + fVar69 * fVar273;
    fVar177 = (fStack_144 * fVar256 + fStack_184 * fVar108) * fVar256 + fVar108 * fVar275;
    fVar178 = (fStack_140 * fVar260 + fStack_180 * fVar109) * fVar260 + fVar109 * fVar277;
    fVar129 = (fStack_13c * fVar261 + fStack_17c * fVar110) * fVar261 + fVar110 * fVar281;
    fVar188 = (local_158 * fVar254 + local_198 * fVar69) * fVar254 + fVar69 * fVar127;
    fVar189 = (fStack_154 * fVar256 + fStack_194 * fVar108) * fVar256 + fVar108 * fVar128;
    fVar142 = (fStack_150 * fVar260 + fStack_190 * fVar109) * fVar260 + fVar109 * fVar140;
    fVar190 = (fStack_14c * fVar261 + fStack_18c * fVar110) * fVar261 + fVar110 * fVar141;
    fVar197 = (local_168 * fVar254 + local_1a8 * fVar69) * fVar254 + fVar69 * fVar226;
    fVar198 = (fStack_164 * fVar256 + fStack_1a4 * fVar108) * fVar256 + fVar108 * fVar227;
    fVar199 = (fStack_160 * fVar260 + fStack_1a0 * fVar109) * fVar260 + fVar109 * fVar241;
    fVar225 = (fStack_15c * fVar261 + fStack_19c * fVar110) * fVar261 + fVar110 * fVar242;
    fVar267 = fVar126 * fVar254 + (local_1b8 * fVar254 + local_1d8 * fVar69) * fVar69;
    fVar268 = fVar268 * fVar256 + (fStack_1b4 * fVar256 + fStack_1d4 * fVar108) * fVar108;
    fVar269 = fVar269 * fVar260 + (fStack_1b0 * fVar260 + fStack_1d0 * fVar109) * fVar109;
    fVar271 = fVar271 * fVar261 + (fStack_1ac * fVar261 + fStack_1cc * fVar110) * fVar110;
    fVar273 = fVar273 * fVar254 + (local_1c8 * fVar254 + local_1e8 * fVar69) * fVar69;
    fVar275 = fVar275 * fVar256 + (fStack_1c4 * fVar256 + fStack_1e4 * fVar108) * fVar108;
    fVar277 = fVar277 * fVar260 + (fStack_1c0 * fVar260 + fStack_1e0 * fVar109) * fVar109;
    fVar281 = fVar281 * fVar261 + (fStack_1bc * fVar261 + fStack_1dc * fVar110) * fVar110;
    fVar126 = fVar127 * fVar254 + (local_268 * fVar254 + local_1f8 * fVar69) * fVar69;
    fVar128 = fVar128 * fVar256 + (fStack_264 * fVar256 + fStack_1f4 * fVar108) * fVar108;
    fVar140 = fVar140 * fVar260 + (fStack_260 * fVar260 + fStack_1f0 * fVar109) * fVar109;
    fVar141 = fVar141 * fVar261 + (fStack_25c * fVar261 + fStack_1ec * fVar110) * fVar110;
    fVar226 = fVar226 * fVar254 + (local_278 * fVar254 + local_208 * fVar69) * fVar69;
    fVar227 = fVar227 * fVar256 + (fStack_274 * fVar256 + fStack_204 * fVar108) * fVar108;
    fVar241 = fVar241 * fVar260 + (fStack_270 * fVar260 + fStack_200 * fVar109) * fVar109;
    fVar242 = fVar242 * fVar261 + (fStack_26c * fVar261 + fStack_1fc * fVar110) * fVar110;
    fVar278 = fVar254 * fVar143 + fVar69 * fVar267;
    fVar282 = fVar256 * fVar155 + fVar108 * fVar268;
    fVar284 = fVar260 * fVar156 + fVar109 * fVar269;
    fVar285 = fVar261 * fVar157 + fVar110 * fVar271;
    fVar286 = fVar254 * fVar176 + fVar69 * fVar273;
    fVar290 = fVar256 * fVar177 + fVar108 * fVar275;
    fVar291 = fVar260 * fVar178 + fVar109 * fVar277;
    fVar292 = fVar261 * fVar129 + fVar110 * fVar281;
    fVar270 = fVar254 * fVar188 + fVar69 * fVar126;
    fVar272 = fVar256 * fVar189 + fVar108 * fVar128;
    fVar274 = fVar260 * fVar142 + fVar109 * fVar140;
    fVar276 = fVar261 * fVar190 + fVar110 * fVar141;
    fVar127 = local_368 * 0.11111111;
    fVar283 = fVar254 * fVar197 + fVar69 * fVar226;
    fVar256 = fVar256 * fVar198 + fVar108 * fVar227;
    auVar263._0_8_ = CONCAT44(fVar256,fVar283);
    auVar263._8_4_ = fVar260 * fVar199 + fVar109 * fVar241;
    auVar263._12_4_ = fVar261 * fVar225 + fVar110 * fVar242;
    local_548 = (fVar267 - fVar143) * 3.0 * fVar127;
    local_508 = (fVar268 - fVar155) * 3.0 * fVar127;
    fStack_504 = (fVar269 - fVar156) * 3.0 * fVar127;
    fStack_500 = (fVar271 - fVar157) * 3.0 * fVar127;
    fVar254 = (fVar273 - fVar176) * 3.0 * fVar127;
    local_518 = (fVar275 - fVar177) * 3.0 * fVar127;
    fStack_514 = (fVar277 - fVar178) * 3.0 * fVar127;
    fStack_510 = (fVar281 - fVar129) * 3.0 * fVar127;
    local_4b8 = (fVar126 - fVar188) * 3.0 * fVar127;
    local_528 = (fVar128 - fVar189) * 3.0 * fVar127;
    fStack_524 = (fVar140 - fVar142) * 3.0 * fVar127;
    fStack_520 = (fVar141 - fVar190) * 3.0 * fVar127;
    fVar69 = fVar127 * (fVar227 - fVar198) * 3.0;
    fVar108 = fVar127 * (fVar241 - fVar199) * 3.0;
    fVar109 = fVar127 * (fVar242 - fVar225) * 3.0;
    local_568._4_4_ = fVar284;
    local_568._0_4_ = fVar282;
    fStack_560 = fVar285;
    fStack_55c = 0.0;
    local_348._4_4_ = fVar291;
    local_348._0_4_ = fVar290;
    fStack_340 = fVar292;
    fStack_33c = 0.0;
    auVar161._4_4_ = auVar263._8_4_;
    auVar161._0_4_ = fVar256;
    auVar161._8_4_ = auVar263._12_4_;
    auVar161._12_4_ = 0;
    local_5a8._4_4_ = fVar256 + fVar69;
    local_5a8._0_4_ = fVar283 + fVar127 * (fVar226 - fVar197) * 3.0;
    fStack_5a0 = auVar263._8_4_ + fVar108;
    fStack_59c = auVar263._12_4_ + fVar109;
    auVar114._0_8_ = CONCAT44(auVar263._8_4_ - fVar108,fVar256 - fVar69);
    auVar114._8_4_ = auVar263._12_4_ - fVar109;
    auVar114._12_4_ = 0;
    local_398 = fVar290 - fVar286;
    fStack_394 = fVar291 - fVar290;
    fStack_390 = fVar292 - fVar291;
    fStack_38c = 0.0 - fVar292;
    local_588._4_4_ = fVar274;
    local_588._0_4_ = fVar272;
    local_588._8_4_ = fVar276;
    local_588._12_4_ = 0;
    local_3c8 = fVar272 - fVar270;
    fStack_3c4 = fVar274 - fVar272;
    fStack_3c0 = fVar276 - fVar274;
    fStack_3bc = 0.0 - fVar276;
    fVar127 = fVar254 * local_3c8 - local_4b8 * local_398;
    fVar69 = local_518 * fStack_3c4 - local_528 * fStack_394;
    fVar108 = fStack_514 * fStack_3c0 - fStack_524 * fStack_390;
    fVar109 = fStack_510 * fStack_3bc - fStack_520 * fStack_38c;
    local_408._0_4_ = fVar282 - fVar278;
    local_408._4_4_ = fVar284 - fVar282;
    fStack_400 = fVar285 - fVar284;
    fStack_3fc = 0.0 - fVar285;
    fVar110 = local_4b8 * (float)local_408._0_4_ - local_548 * local_3c8;
    fVar128 = local_528 * (float)local_408._4_4_ - local_508 * fStack_3c4;
    fVar141 = fStack_524 * fStack_400 - fStack_504 * fStack_3c0;
    fVar155 = fStack_520 * fStack_3fc - fStack_500 * fStack_3bc;
    fVar126 = local_548 * local_398 - fVar254 * (float)local_408._0_4_;
    fVar140 = local_508 * fStack_394 - local_518 * (float)local_408._4_4_;
    fVar143 = fStack_504 * fStack_390 - fStack_514 * fStack_400;
    fVar156 = fStack_500 * fStack_38c - fStack_510 * fStack_3fc;
    auVar217._0_4_ = fVar126 * fVar126;
    auVar217._4_4_ = fVar140 * fVar140;
    auVar217._8_4_ = fVar143 * fVar143;
    auVar217._12_4_ = fVar156 * fVar156;
    auVar147._0_4_ =
         (float)local_408._0_4_ * (float)local_408._0_4_ +
         local_398 * local_398 + local_3c8 * local_3c8;
    auVar147._4_4_ =
         (float)local_408._4_4_ * (float)local_408._4_4_ +
         fStack_394 * fStack_394 + fStack_3c4 * fStack_3c4;
    auVar147._8_4_ = fStack_400 * fStack_400 + fStack_390 * fStack_390 + fStack_3c0 * fStack_3c0;
    auVar147._12_4_ = fStack_3fc * fStack_3fc + fStack_38c * fStack_38c + fStack_3bc * fStack_3bc;
    auVar79 = rcpps(auVar217,auVar147);
    fVar126 = auVar79._0_4_;
    fVar140 = auVar79._4_4_;
    fVar143 = auVar79._8_4_;
    fVar156 = auVar79._12_4_;
    fVar126 = (1.0 - fVar126 * auVar147._0_4_) * fVar126 + fVar126;
    fVar140 = (1.0 - fVar140 * auVar147._4_4_) * fVar140 + fVar140;
    fVar143 = (1.0 - fVar143 * auVar147._8_4_) * fVar143 + fVar143;
    fVar156 = (1.0 - fVar156 * auVar147._12_4_) * fVar156 + fVar156;
    fVar157 = local_3c8 * local_518 - local_398 * local_528;
    fVar176 = fStack_3c4 * fStack_514 - fStack_394 * fStack_524;
    fVar177 = fStack_3c0 * fStack_510 - fStack_390 * fStack_520;
    fVar178 = fStack_3bc * 0.0 - fStack_38c * 0.0;
    fStack_51c = 0.0;
    fVar129 = (float)local_408._0_4_ * local_528 - local_3c8 * local_508;
    fVar188 = (float)local_408._4_4_ * fStack_524 - fStack_3c4 * fStack_504;
    fVar189 = fStack_400 * fStack_520 - fStack_3c0 * fStack_500;
    fVar142 = fStack_3fc * 0.0 - fStack_3bc * 0.0;
    fStack_50c = 0.0;
    fStack_4fc = 0.0;
    fVar190 = local_398 * local_508 - (float)local_408._0_4_ * local_518;
    fVar197 = fStack_394 * fStack_504 - (float)local_408._4_4_ * fStack_514;
    fVar198 = fStack_390 * fStack_500 - fStack_400 * fStack_510;
    fVar199 = fStack_38c * 0.0 - fStack_3fc * 0.0;
    auVar279._0_4_ = fVar190 * fVar190;
    auVar279._4_4_ = fVar197 * fVar197;
    auVar279._8_4_ = fVar198 * fVar198;
    auVar279._12_4_ = fVar199 * fVar199;
    auVar91._0_4_ = (fVar127 * fVar127 + fVar110 * fVar110 + auVar217._0_4_) * fVar126;
    auVar91._4_4_ = (fVar69 * fVar69 + fVar128 * fVar128 + auVar217._4_4_) * fVar140;
    auVar91._8_4_ = (fVar108 * fVar108 + fVar141 * fVar141 + auVar217._8_4_) * fVar143;
    auVar91._12_4_ = (fVar109 * fVar109 + fVar155 * fVar155 + auVar217._12_4_) * fVar156;
    auVar232._0_4_ = (fVar157 * fVar157 + fVar129 * fVar129 + auVar279._0_4_) * fVar126;
    auVar232._4_4_ = (fVar176 * fVar176 + fVar188 * fVar188 + auVar279._4_4_) * fVar140;
    auVar232._8_4_ = (fVar177 * fVar177 + fVar189 * fVar189 + auVar279._8_4_) * fVar143;
    auVar232._12_4_ = (fVar178 * fVar178 + fVar142 * fVar142 + auVar279._12_4_) * fVar156;
    auVar79 = maxps(auVar91,auVar232);
    auVar218._8_4_ = auVar263._8_4_;
    auVar218._0_8_ = auVar263._0_8_;
    auVar218._12_4_ = auVar263._12_4_;
    auVar219 = maxps(auVar218,_local_5a8);
    auVar183._8_4_ = auVar114._8_4_;
    auVar183._0_8_ = auVar114._0_8_;
    auVar183._12_4_ = 0;
    auVar245 = maxps(auVar183,auVar161);
    auVar219 = maxps(auVar219,auVar245);
    auVar264 = minps(auVar263,_local_5a8);
    auVar245 = minps(auVar114,auVar161);
    auVar245 = minps(auVar264,auVar245);
    auVar79 = sqrtps(auVar79,auVar79);
    auVar264 = rsqrtps(auVar279,auVar147);
    fVar127 = auVar264._0_4_;
    fVar69 = auVar264._4_4_;
    fVar108 = auVar264._8_4_;
    fVar109 = auVar264._12_4_;
    local_2e8 = fVar127 * fVar127 * auVar147._0_4_ * -0.5 * fVar127 + fVar127 * 1.5;
    fStack_2e4 = fVar69 * fVar69 * auVar147._4_4_ * -0.5 * fVar69 + fVar69 * 1.5;
    fStack_2e0 = fVar108 * fVar108 * auVar147._8_4_ * -0.5 * fVar108 + fVar108 * 1.5;
    fStack_2dc = fVar109 * fVar109 * auVar147._12_4_ * -0.5 * fVar109 + fVar109 * 1.5;
    local_358 = 0.0 - fVar286;
    fStack_354 = 0.0 - fVar290;
    fStack_350 = 0.0 - fVar291;
    fStack_34c = 0.0 - fVar292;
    fVar127 = 0.0 - fVar270;
    fVar69 = 0.0 - fVar272;
    fVar108 = 0.0 - fVar274;
    fVar109 = 0.0 - fVar276;
    fVar110 = 0.0 - fVar278;
    fVar126 = 0.0 - fVar282;
    fVar128 = 0.0 - fVar284;
    fVar140 = 0.0 - fVar285;
    local_418._0_4_ =
         local_318 * (float)local_408._0_4_ * local_2e8 +
         local_3e8 * local_398 * local_2e8 + local_3d8 * local_3c8 * local_2e8;
    local_418._4_4_ =
         fStack_314 * (float)local_408._4_4_ * fStack_2e4 +
         fStack_3e4 * fStack_394 * fStack_2e4 + fStack_3d4 * fStack_3c4 * fStack_2e4;
    fStack_410 = fStack_310 * fStack_400 * fStack_2e0 +
                 fStack_3e0 * fStack_390 * fStack_2e0 + fStack_3d0 * fStack_3c0 * fStack_2e0;
    fStack_40c = fStack_30c * fStack_3fc * fStack_2dc +
                 fStack_3dc * fStack_38c * fStack_2dc + fStack_3cc * fStack_3bc * fStack_2dc;
    auVar287._0_4_ = local_398 * local_2e8 * local_358 + local_3c8 * local_2e8 * fVar127;
    auVar287._4_4_ = fStack_394 * fStack_2e4 * fStack_354 + fStack_3c4 * fStack_2e4 * fVar69;
    auVar287._8_4_ = fStack_390 * fStack_2e0 * fStack_350 + fStack_3c0 * fStack_2e0 * fVar108;
    auVar287._12_4_ = fStack_38c * fStack_2dc * fStack_34c + fStack_3bc * fStack_2dc * fVar109;
    local_2d8._0_4_ = (float)local_408._0_4_ * local_2e8 * fVar110 + auVar287._0_4_;
    local_2d8._4_4_ = (float)local_408._4_4_ * fStack_2e4 * fVar126 + auVar287._4_4_;
    fStack_2d0 = fStack_400 * fStack_2e0 * fVar128 + auVar287._8_4_;
    fStack_2cc = fStack_3fc * fStack_2dc * fVar140 + auVar287._12_4_;
    fVar157 = (local_318 * fVar110 + local_3e8 * local_358 + local_3d8 * fVar127) -
              (float)local_418._0_4_ * (float)local_2d8._0_4_;
    fVar176 = (fStack_314 * fVar126 + fStack_3e4 * fStack_354 + fStack_3d4 * fVar69) -
              (float)local_418._4_4_ * (float)local_2d8._4_4_;
    fVar177 = (fStack_310 * fVar128 + fStack_3e0 * fStack_350 + fStack_3d0 * fVar108) -
              fStack_410 * fStack_2d0;
    fVar178 = (fStack_30c * fVar140 + fStack_3dc * fStack_34c + fStack_3cc * fVar109) -
              fStack_40c * fStack_2cc;
    local_538._0_4_ =
         (fVar110 * fVar110 + local_358 * local_358 + fVar127 * fVar127) -
         (float)local_2d8._0_4_ * (float)local_2d8._0_4_;
    local_538._4_4_ =
         (fVar126 * fVar126 + fStack_354 * fStack_354 + fVar69 * fVar69) -
         (float)local_2d8._4_4_ * (float)local_2d8._4_4_;
    fStack_530 = (fVar128 * fVar128 + fStack_350 * fStack_350 + fVar108 * fVar108) -
                 fStack_2d0 * fStack_2d0;
    fStack_52c = (fVar140 * fVar140 + fStack_34c * fStack_34c + fVar109 * fVar109) -
                 fStack_2cc * fStack_2cc;
    fVar141 = (auVar219._0_4_ + auVar79._0_4_) * 1.0000002;
    fVar143 = (auVar219._4_4_ + auVar79._4_4_) * 1.0000002;
    fVar155 = (auVar219._8_4_ + auVar79._8_4_) * 1.0000002;
    fVar156 = (auVar219._12_4_ + auVar79._12_4_) * 1.0000002;
    auVar184._0_4_ = (float)local_538._0_4_ - fVar141 * fVar141;
    auVar184._4_4_ = (float)local_538._4_4_ - fVar143 * fVar143;
    auVar184._8_4_ = fStack_530 - fVar155 * fVar155;
    auVar184._12_4_ = fStack_52c - fVar156 * fVar156;
    local_228 = (float)local_418._0_4_ * (float)local_418._0_4_;
    fStack_224 = (float)local_418._4_4_ * (float)local_418._4_4_;
    fStack_220 = fStack_410 * fStack_410;
    fStack_21c = fStack_40c * fStack_40c;
    local_328._0_4_ = local_128 - local_228;
    local_328._4_4_ = fStack_124 - fStack_224;
    fStack_320 = fStack_120 - fStack_220;
    fStack_31c = fStack_11c - fStack_21c;
    fVar157 = fVar157 + fVar157;
    fVar176 = fVar176 + fVar176;
    fVar177 = fVar177 + fVar177;
    fVar178 = fVar178 + fVar178;
    local_388 = fVar157 * fVar157;
    fStack_384 = fVar176 * fVar176;
    fStack_380 = fVar177 * fVar177;
    fStack_37c = fVar178 * fVar178;
    local_428._0_4_ = (float)local_328._0_4_ * 4.0;
    local_428._4_4_ = (float)local_328._4_4_ * 4.0;
    fStack_420 = fStack_320 * 4.0;
    fStack_41c = fStack_31c * 4.0;
    auVar220._0_4_ = local_388 - (float)local_428._0_4_ * auVar184._0_4_;
    auVar220._4_4_ = fStack_384 - (float)local_428._4_4_ * auVar184._4_4_;
    auVar220._8_4_ = fStack_380 - fStack_420 * auVar184._8_4_;
    auVar220._12_4_ = fStack_37c - fStack_41c * auVar184._12_4_;
    auVar265._0_4_ = (auVar245._0_4_ - auVar79._0_4_) * 0.99999976;
    auVar265._4_4_ = (auVar245._4_4_ - auVar79._4_4_) * 0.99999976;
    auVar265._8_4_ = (auVar245._8_4_ - auVar79._8_4_) * 0.99999976;
    auVar265._12_4_ = (auVar245._12_4_ - auVar79._12_4_) * 0.99999976;
    auVar162._4_4_ = -(uint)(0.0 <= auVar220._4_4_);
    auVar162._0_4_ = -(uint)(0.0 <= auVar220._0_4_);
    auVar162._8_4_ = -(uint)(0.0 <= auVar220._8_4_);
    auVar162._12_4_ = -(uint)(0.0 <= auVar220._12_4_);
    uVar52 = 0;
    iVar46 = movmskps((int)uVar49,auVar162);
    if (iVar46 == 0) {
      iVar46 = 0;
      auVar116 = _DAT_01feb9f0;
      auVar186 = _DAT_01feba00;
    }
    else {
      auVar245 = sqrtps(auVar287,auVar220);
      bVar8 = 0.0 <= auVar220._0_4_;
      uVar61 = -(uint)bVar8;
      bVar58 = 0.0 <= auVar220._4_4_;
      uVar63 = -(uint)bVar58;
      bVar9 = 0.0 <= auVar220._8_4_;
      uVar65 = -(uint)bVar9;
      bVar10 = 0.0 <= auVar220._12_4_;
      uVar66 = -(uint)bVar10;
      auVar115._0_4_ = (float)local_328._0_4_ + (float)local_328._0_4_;
      auVar115._4_4_ = (float)local_328._4_4_ + (float)local_328._4_4_;
      auVar115._8_4_ = fStack_320 + fStack_320;
      auVar115._12_4_ = fStack_31c + fStack_31c;
      auVar79 = rcpps(auVar184,auVar115);
      fVar141 = auVar79._0_4_;
      fVar155 = auVar79._4_4_;
      fVar129 = auVar79._8_4_;
      fVar189 = auVar79._12_4_;
      fVar141 = (1.0 - auVar115._0_4_ * fVar141) * fVar141 + fVar141;
      fVar155 = (1.0 - auVar115._4_4_ * fVar155) * fVar155 + fVar155;
      fVar129 = (1.0 - auVar115._8_4_ * fVar129) * fVar129 + fVar129;
      fVar189 = (1.0 - auVar115._12_4_ * fVar189) * fVar189 + fVar189;
      fVar143 = (-fVar157 - auVar245._0_4_) * fVar141;
      fVar156 = (-fVar176 - auVar245._4_4_) * fVar155;
      fVar188 = (-fVar177 - auVar245._8_4_) * fVar129;
      fVar142 = (-fVar178 - auVar245._12_4_) * fVar189;
      fVar141 = (auVar245._0_4_ - fVar157) * fVar141;
      fVar155 = (auVar245._4_4_ - fVar176) * fVar155;
      fVar129 = (auVar245._8_4_ - fVar177) * fVar129;
      fVar189 = (auVar245._12_4_ - fVar178) * fVar189;
      local_2a8._4_4_ = ((float)local_418._4_4_ * fVar156 + (float)local_2d8._4_4_) * fStack_2e4;
      local_2a8._0_4_ = ((float)local_418._0_4_ * fVar143 + (float)local_2d8._0_4_) * local_2e8;
      fStack_2a0 = (fStack_410 * fVar188 + fStack_2d0) * fStack_2e0;
      fStack_29c = (fStack_40c * fVar142 + fStack_2cc) * fStack_2dc;
      local_2b8[0] = ((float)local_418._0_4_ * fVar141 + (float)local_2d8._0_4_) * local_2e8;
      local_2b8[1] = ((float)local_418._4_4_ * fVar155 + (float)local_2d8._4_4_) * fStack_2e4;
      local_2b8[2] = (fStack_410 * fVar129 + fStack_2d0) * fStack_2e0;
      local_2b8[3] = (fStack_40c * fVar189 + fStack_2cc) * fStack_2dc;
      auVar185._0_4_ = (uint)fVar143 & uVar61;
      auVar185._4_4_ = (uint)fVar156 & uVar63;
      auVar185._8_4_ = (uint)fVar188 & uVar65;
      auVar185._12_4_ = (uint)fVar142 & uVar66;
      auVar116._0_8_ = CONCAT44(~uVar63,~uVar61) & 0x7f8000007f800000;
      auVar116._8_4_ = ~uVar65 & 0x7f800000;
      auVar116._12_4_ = ~uVar66 & 0x7f800000;
      auVar116 = auVar116 | auVar185;
      auVar288._0_4_ = (uint)fVar141 & uVar61;
      auVar288._4_4_ = (uint)fVar155 & uVar63;
      auVar288._8_4_ = (uint)fVar129 & uVar65;
      auVar288._12_4_ = (uint)fVar189 & uVar66;
      auVar186._0_8_ = CONCAT44(~uVar63,~uVar61) & 0xff800000ff800000;
      auVar186._8_4_ = ~uVar65 & 0xff800000;
      auVar186._12_4_ = ~uVar66 & 0xff800000;
      auVar186 = auVar186 | auVar288;
      auVar233._0_8_ = CONCAT44(fStack_224,local_228) & 0x7fffffff7fffffff;
      auVar233._8_4_ = ABS(fStack_220);
      auVar233._12_4_ = ABS(fStack_21c);
      auVar28._4_4_ = fStack_284;
      auVar28._0_4_ = local_288;
      auVar28._8_4_ = fStack_280;
      auVar28._12_4_ = fStack_27c;
      auVar79 = maxps(auVar28,auVar233);
      fVar141 = auVar79._0_4_ * 1.9073486e-06;
      fVar143 = auVar79._4_4_ * 1.9073486e-06;
      fVar155 = auVar79._8_4_ * 1.9073486e-06;
      fVar156 = auVar79._12_4_ * 1.9073486e-06;
      auVar234._0_4_ = -(uint)(ABS((float)local_328._0_4_) < fVar141 && bVar8);
      auVar234._4_4_ = -(uint)(ABS((float)local_328._4_4_) < fVar143 && bVar58);
      auVar234._8_4_ = -(uint)(ABS(fStack_320) < fVar155 && bVar9);
      auVar234._12_4_ = -(uint)(ABS(fStack_31c) < fVar156 && bVar10);
      iVar46 = movmskps(iVar46,auVar234);
      if (iVar46 != 0) {
        uVar61 = -(uint)(auVar184._0_4_ <= 0.0);
        uVar63 = -(uint)(auVar184._4_4_ <= 0.0);
        uVar65 = -(uint)(auVar184._8_4_ <= 0.0);
        uVar66 = -(uint)(auVar184._12_4_ <= 0.0);
        auVar280._0_4_ = (uVar61 & 0xff800000 | ~uVar61 & 0x7f800000) & auVar234._0_4_;
        auVar280._4_4_ = (uVar63 & 0xff800000 | ~uVar63 & 0x7f800000) & auVar234._4_4_;
        auVar280._8_4_ = (uVar65 & 0xff800000 | ~uVar65 & 0x7f800000) & auVar234._8_4_;
        auVar280._12_4_ = (uVar66 & 0xff800000 | ~uVar66 & 0x7f800000) & auVar234._12_4_;
        auVar173._0_4_ = ~auVar234._0_4_ & auVar116._0_4_;
        auVar173._4_4_ = ~auVar234._4_4_ & auVar116._4_4_;
        auVar173._8_4_ = ~auVar234._8_4_ & auVar116._8_4_;
        auVar173._12_4_ = ~auVar234._12_4_ & auVar116._12_4_;
        auVar116 = auVar173 | auVar280;
        auVar174._0_4_ = (uVar61 & 0x7f800000 | ~uVar61 & 0xff800000) & auVar234._0_4_;
        auVar174._4_4_ = (uVar63 & 0x7f800000 | ~uVar63 & 0xff800000) & auVar234._4_4_;
        auVar174._8_4_ = (uVar65 & 0x7f800000 | ~uVar65 & 0xff800000) & auVar234._8_4_;
        auVar174._12_4_ = (uVar66 & 0x7f800000 | ~uVar66 & 0xff800000) & auVar234._12_4_;
        auVar240._0_4_ = ~auVar234._0_4_ & auVar186._0_4_;
        auVar240._4_4_ = ~auVar234._4_4_ & auVar186._4_4_;
        auVar240._8_4_ = ~auVar234._8_4_ & auVar186._8_4_;
        auVar240._12_4_ = ~auVar234._12_4_ & auVar186._12_4_;
        auVar186 = auVar240 | auVar174;
        auVar162._4_4_ =
             -(uint)((fVar143 <= ABS((float)local_328._4_4_) || auVar184._4_4_ <= 0.0) && bVar58);
        auVar162._0_4_ =
             -(uint)((fVar141 <= ABS((float)local_328._0_4_) || auVar184._0_4_ <= 0.0) && bVar8);
        auVar162._8_4_ = -(uint)((fVar155 <= ABS(fStack_320) || auVar184._8_4_ <= 0.0) && bVar9);
        auVar162._12_4_ = -(uint)((fVar156 <= ABS(fStack_31c) || auVar184._12_4_ <= 0.0) && bVar10);
      }
    }
    auVar163._0_4_ = (auVar162._0_4_ << 0x1f) >> 0x1f;
    auVar163._4_4_ = (auVar162._4_4_ << 0x1f) >> 0x1f;
    auVar163._8_4_ = (auVar162._8_4_ << 0x1f) >> 0x1f;
    auVar163._12_4_ = (auVar162._12_4_ << 0x1f) >> 0x1f;
    auVar163 = auVar163 & local_218;
    iVar46 = movmskps(iVar46,auVar163);
    uVar49 = uVar56;
    if (iVar46 != 0) {
      auVar221._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_2c8._0_4_;
      auVar221._4_4_ = auVar221._0_4_;
      auVar221._8_4_ = auVar221._0_4_;
      auVar221._12_4_ = auVar221._0_4_;
      auVar245 = maxps(auVar221,auVar116);
      auVar289._0_4_ = (ray->super_RayK<1>).tfar - (float)local_2c8._0_4_;
      auVar289._4_4_ = auVar289._0_4_;
      auVar289._8_4_ = auVar289._0_4_;
      auVar289._12_4_ = auVar289._0_4_;
      auVar219 = minps(auVar289,auVar186);
      auVar92._0_4_ = fVar127 * local_4b8;
      auVar92._4_4_ = fVar69 * local_528;
      auVar92._8_4_ = fVar108 * fStack_524;
      auVar92._12_4_ = fVar109 * fStack_520;
      auVar246._0_4_ = local_548 * local_318 + fVar254 * local_3e8 + local_4b8 * local_3d8;
      auVar246._4_4_ = local_508 * fStack_314 + local_518 * fStack_3e4 + local_528 * fStack_3d4;
      auVar246._8_4_ = fStack_504 * fStack_310 + fStack_514 * fStack_3e0 + fStack_524 * fStack_3d0;
      auVar246._12_4_ = fStack_500 * fStack_30c + fStack_510 * fStack_3dc + fStack_520 * fStack_3cc;
      auVar79 = rcpps(auVar92,auVar246);
      fVar127 = auVar79._0_4_;
      fVar69 = auVar79._4_4_;
      fVar108 = auVar79._8_4_;
      fVar109 = auVar79._12_4_;
      fVar127 = ((fVar243 - auVar246._0_4_ * fVar127) * fVar127 + fVar127) *
                -(fVar110 * local_548 + local_358 * fVar254 + auVar92._0_4_);
      fVar69 = ((fVar255 - auVar246._4_4_ * fVar69) * fVar69 + fVar69) *
               -(fVar126 * local_508 + fStack_354 * local_518 + auVar92._4_4_);
      fVar108 = ((fVar259 - auVar246._8_4_ * fVar108) * fVar108 + fVar108) *
                -(fVar128 * fStack_504 + fStack_350 * fStack_514 + auVar92._8_4_);
      fVar109 = ((fVar266 - auVar246._12_4_ * fVar109) * fVar109 + fVar109) *
                -(fVar140 * fStack_500 + fStack_34c * fStack_510 + auVar92._12_4_);
      auVar196._0_12_ = ZEXT812(0);
      auVar196._12_4_ = 0.0;
      uVar61 = -(uint)(auVar246._0_4_ < 0.0 || ABS(auVar246._0_4_) < 1e-18);
      uVar63 = -(uint)(auVar246._4_4_ < 0.0 || ABS(auVar246._4_4_) < 1e-18);
      uVar65 = -(uint)(auVar246._8_4_ < 0.0 || ABS(auVar246._8_4_) < 1e-18);
      uVar66 = -(uint)(auVar246._12_4_ < 0.0 || ABS(auVar246._12_4_) < 1e-18);
      auVar187._0_8_ = CONCAT44(uVar63,uVar61) & 0xff800000ff800000;
      auVar187._8_4_ = uVar65 & 0xff800000;
      auVar187._12_4_ = uVar66 & 0xff800000;
      auVar93._0_4_ = ~uVar61 & (uint)fVar127;
      auVar93._4_4_ = ~uVar63 & (uint)fVar69;
      auVar93._8_4_ = ~uVar65 & (uint)fVar108;
      auVar93._12_4_ = ~uVar66 & (uint)fVar109;
      auVar245 = maxps(auVar245,auVar93 | auVar187);
      uVar61 = -(uint)(0.0 < auVar246._0_4_ || ABS(auVar246._0_4_) < 1e-18);
      uVar63 = -(uint)(0.0 < auVar246._4_4_ || ABS(auVar246._4_4_) < 1e-18);
      uVar65 = -(uint)(0.0 < auVar246._8_4_ || ABS(auVar246._8_4_) < 1e-18);
      uVar66 = -(uint)(0.0 < auVar246._12_4_ || ABS(auVar246._12_4_) < 1e-18);
      auVar94._0_8_ = CONCAT44(uVar63,uVar61) & 0x7f8000007f800000;
      auVar94._8_4_ = uVar65 & 0x7f800000;
      auVar94._12_4_ = uVar66 & 0x7f800000;
      auVar247._0_4_ = ~uVar61 & (uint)fVar127;
      auVar247._4_4_ = ~uVar63 & (uint)fVar69;
      auVar247._8_4_ = ~uVar65 & (uint)fVar108;
      auVar247._12_4_ = ~uVar66 & (uint)fVar109;
      auVar219 = minps(auVar219,auVar247 | auVar94);
      auVar117._0_4_ = (0.0 - fVar290) * -local_518 + (0.0 - fVar272) * -local_528;
      auVar117._4_4_ = (0.0 - fVar291) * -fStack_514 + (0.0 - fVar274) * -fStack_524;
      auVar117._8_4_ = (0.0 - fVar292) * -fStack_510 + (0.0 - fVar276) * -fStack_520;
      auVar117._12_4_ = 0x80000000;
      auVar248._0_4_ = -local_508 * local_318 + -local_518 * local_3e8 + -local_528 * local_3d8;
      auVar248._4_4_ =
           -fStack_504 * fStack_314 + -fStack_514 * fStack_3e4 + -fStack_524 * fStack_3d4;
      auVar248._8_4_ =
           -fStack_500 * fStack_310 + -fStack_510 * fStack_3e0 + -fStack_520 * fStack_3d0;
      auVar248._12_4_ = fStack_30c * -0.0 + fStack_3dc * -0.0 + fStack_3cc * -0.0;
      auVar79 = rcpps(auVar117,auVar248);
      fVar127 = auVar79._0_4_;
      fVar69 = auVar79._4_4_;
      fVar108 = auVar79._8_4_;
      fVar109 = auVar79._12_4_;
      fVar127 = ((fVar243 - auVar248._0_4_ * fVar127) * fVar127 + fVar127) *
                -((0.0 - fVar282) * -local_508 + auVar117._0_4_);
      fVar69 = ((fVar255 - auVar248._4_4_ * fVar69) * fVar69 + fVar69) *
               -((0.0 - fVar284) * -fStack_504 + auVar117._4_4_);
      fVar108 = ((fVar259 - auVar248._8_4_ * fVar108) * fVar108 + fVar108) *
                -((0.0 - fVar285) * -fStack_500 + auVar117._8_4_);
      fVar109 = ((fVar266 - auVar248._12_4_ * fVar109) * fVar109 + fVar109) * 0.0;
      uVar61 = -(uint)(auVar248._0_4_ < 0.0 || ABS(auVar248._0_4_) < 1e-18);
      uVar63 = -(uint)(auVar248._4_4_ < 0.0 || ABS(auVar248._4_4_) < 1e-18);
      uVar65 = -(uint)(auVar248._8_4_ < 0.0 || ABS(auVar248._8_4_) < 1e-18);
      uVar66 = -(uint)(auVar248._12_4_ < 0.0 || ABS(auVar248._12_4_) < 1e-18);
      auVar118._0_8_ = CONCAT44(uVar63,uVar61) & 0xff800000ff800000;
      auVar118._8_4_ = uVar65 & 0xff800000;
      auVar118._12_4_ = uVar66 & 0xff800000;
      auVar95._0_4_ = ~uVar61 & (uint)fVar127;
      auVar95._4_4_ = ~uVar63 & (uint)fVar69;
      auVar95._8_4_ = ~uVar65 & (uint)fVar108;
      auVar95._12_4_ = ~uVar66 & (uint)fVar109;
      local_3b8 = maxps(auVar245,auVar95 | auVar118);
      uVar61 = -(uint)(0.0 < auVar248._0_4_ || ABS(auVar248._0_4_) < 1e-18);
      uVar63 = -(uint)(0.0 < auVar248._4_4_ || ABS(auVar248._4_4_) < 1e-18);
      uVar65 = -(uint)(0.0 < auVar248._8_4_ || ABS(auVar248._8_4_) < 1e-18);
      uVar66 = -(uint)(0.0 < auVar248._12_4_ || ABS(auVar248._12_4_) < 1e-18);
      auVar96._0_8_ = CONCAT44(uVar63,uVar61) & 0x7f8000007f800000;
      auVar96._8_4_ = uVar65 & 0x7f800000;
      auVar96._12_4_ = uVar66 & 0x7f800000;
      auVar249._0_4_ = ~uVar61 & (uint)fVar127;
      auVar249._4_4_ = ~uVar63 & (uint)fVar69;
      auVar249._8_4_ = ~uVar65 & (uint)fVar108;
      auVar249._12_4_ = ~uVar66 & (uint)fVar109;
      local_248 = minps(auVar219,auVar249 | auVar96);
      fVar127 = local_3b8._0_4_;
      fVar69 = local_3b8._4_4_;
      fVar108 = local_3b8._8_4_;
      fVar109 = local_3b8._12_4_;
      uVar61 = -(uint)(fVar127 <= local_248._0_4_) & auVar163._0_4_;
      uVar63 = -(uint)(fVar69 <= local_248._4_4_) & auVar163._4_4_;
      uVar65 = -(uint)(fVar108 <= local_248._8_4_) & auVar163._8_4_;
      uVar66 = -(uint)(fVar109 <= local_248._12_4_) & auVar163._12_4_;
      auVar11._4_4_ = uVar63;
      auVar11._0_4_ = uVar61;
      auVar11._8_4_ = uVar65;
      auVar11._12_4_ = uVar66;
      iVar46 = movmskps(iVar46,auVar11);
      if (iVar46 != 0) {
        auVar79 = maxps(ZEXT816(0),auVar265);
        auVar245 = minps(_local_2a8,_DAT_01feca10);
        auVar245 = maxps(auVar245,auVar196);
        auVar27._4_4_ = local_2b8[1];
        auVar27._0_4_ = local_2b8[0];
        auVar27._8_4_ = local_2b8[2];
        auVar27._12_4_ = local_2b8[3];
        auVar219 = minps(auVar27,_DAT_01feca10);
        auVar219 = maxps(auVar219,auVar196);
        local_2a8._0_4_ = (auVar245._0_4_ + 0.0) * (float)DAT_01ff1da0 * local_368 + local_3f8;
        local_2a8._4_4_ = (auVar245._4_4_ + 1.0) * DAT_01ff1da0._4_4_ * local_368 + local_3f8;
        fStack_2a0 = (auVar245._8_4_ + 2.0) * DAT_01ff1da0._8_4_ * local_368 + local_3f8;
        fStack_29c = (auVar245._12_4_ + 3.0) * DAT_01ff1da0._12_4_ * local_368 + local_3f8;
        local_2b8[0] = (auVar219._0_4_ + 0.0) * (float)DAT_01ff1da0 * local_368 + local_3f8;
        local_2b8[1] = (auVar219._4_4_ + 1.0) * DAT_01ff1da0._4_4_ * local_368 + local_3f8;
        local_2b8[2] = (auVar219._8_4_ + 2.0) * DAT_01ff1da0._8_4_ * local_368 + local_3f8;
        local_2b8[3] = (auVar219._12_4_ + 3.0) * DAT_01ff1da0._12_4_ * local_368 + local_3f8;
        fVar110 = (float)local_538._0_4_ - auVar79._0_4_ * auVar79._0_4_;
        fVar126 = (float)local_538._4_4_ - auVar79._4_4_ * auVar79._4_4_;
        fVar128 = fStack_530 - auVar79._8_4_ * auVar79._8_4_;
        fVar140 = fStack_52c - auVar79._12_4_ * auVar79._12_4_;
        auVar222._0_4_ = local_388 - (float)local_428._0_4_ * fVar110;
        auVar222._4_4_ = fStack_384 - (float)local_428._4_4_ * fVar126;
        auVar222._8_4_ = fStack_380 - fStack_420 * fVar128;
        auVar222._12_4_ = fStack_37c - fStack_41c * fVar140;
        local_428._4_4_ = -(uint)(0.0 <= auVar222._4_4_);
        local_428._0_4_ = -(uint)(0.0 <= auVar222._0_4_);
        fStack_420 = (float)-(uint)(0.0 <= auVar222._8_4_);
        fStack_41c = (float)-(uint)(0.0 <= auVar222._12_4_);
        iVar46 = movmskps(iVar46,_local_428);
        if (iVar46 == 0) {
          fVar190 = 0.0;
          fVar197 = 0.0;
          fVar198 = 0.0;
          fVar199 = 0.0;
          fVar129 = 0.0;
          fVar188 = 0.0;
          fVar189 = 0.0;
          fVar142 = 0.0;
          fVar141 = 0.0;
          fVar143 = 0.0;
          fVar155 = 0.0;
          fVar156 = 0.0;
          fVar157 = 0.0;
          fVar176 = 0.0;
          fVar177 = 0.0;
          fVar178 = 0.0;
          _local_498 = ZEXT816(0);
          iVar46 = 0;
          auVar119 = _DAT_01feba00;
          auVar235 = _DAT_01feb9f0;
          fStack_544 = local_508;
          fStack_540 = fStack_504;
          fStack_53c = fStack_500;
        }
        else {
          local_568._4_4_ = uVar63;
          local_568._0_4_ = uVar61;
          fStack_560 = (float)uVar65;
          fStack_55c = (float)uVar66;
          local_538._4_4_ = fVar126;
          local_538._0_4_ = fVar110;
          fStack_530 = fVar128;
          fStack_52c = fVar140;
          auVar245 = sqrtps(_DAT_01ff1da0,auVar222);
          auVar97._0_4_ = (float)local_328._0_4_ + (float)local_328._0_4_;
          auVar97._4_4_ = (float)local_328._4_4_ + (float)local_328._4_4_;
          auVar97._8_4_ = fStack_320 + fStack_320;
          auVar97._12_4_ = fStack_31c + fStack_31c;
          auVar79 = rcpps(_local_2a8,auVar97);
          fVar225 = auVar79._0_4_;
          fVar226 = auVar79._4_4_;
          fVar227 = auVar79._8_4_;
          fVar241 = auVar79._12_4_;
          fVar225 = (fVar243 - auVar97._0_4_ * fVar225) * fVar225 + fVar225;
          fVar226 = (fVar255 - auVar97._4_4_ * fVar226) * fVar226 + fVar226;
          fVar227 = (fVar259 - auVar97._8_4_ * fVar227) * fVar227 + fVar227;
          fVar241 = (fVar266 - auVar97._12_4_ * fVar241) * fVar241 + fVar241;
          fVar242 = (-fVar157 - auVar245._0_4_) * fVar225;
          fVar243 = (-fVar176 - auVar245._4_4_) * fVar226;
          fVar254 = (-fVar177 - auVar245._8_4_) * fVar227;
          fVar255 = (-fVar178 - auVar245._12_4_) * fVar241;
          fVar225 = (auVar245._0_4_ - fVar157) * fVar225;
          fVar226 = (auVar245._4_4_ - fVar176) * fVar226;
          fVar227 = (auVar245._8_4_ - fVar177) * fVar227;
          fVar241 = (auVar245._12_4_ - fVar178) * fVar241;
          fVar129 = ((float)local_418._0_4_ * fVar242 + (float)local_2d8._0_4_) * local_2e8;
          fVar188 = ((float)local_418._4_4_ * fVar243 + (float)local_2d8._4_4_) * fStack_2e4;
          fVar189 = (fStack_410 * fVar254 + fStack_2d0) * fStack_2e0;
          fVar142 = (fStack_40c * fVar255 + fStack_2cc) * fStack_2dc;
          fVar141 = local_318 * fVar242 - ((float)local_408._0_4_ * fVar129 + fVar278);
          fVar143 = fStack_314 * fVar243 - ((float)local_408._4_4_ * fVar188 + fVar282);
          fVar155 = fStack_310 * fVar254 - (fStack_400 * fVar189 + fVar284);
          fVar156 = fStack_30c * fVar255 - (fStack_3fc * fVar142 + fVar285);
          fVar157 = local_3e8 * fVar242 - (local_398 * fVar129 + fVar286);
          fVar176 = fStack_3e4 * fVar243 - (fStack_394 * fVar188 + fVar290);
          fVar177 = fStack_3e0 * fVar254 - (fStack_390 * fVar189 + fVar291);
          fVar178 = fStack_3dc * fVar255 - (fStack_38c * fVar142 + fVar292);
          local_498._4_4_ = fStack_3d4 * fVar243 - (fVar188 * fStack_3c4 + fVar272);
          local_498._0_4_ = local_3d8 * fVar242 - (fVar129 * local_3c8 + fVar270);
          fStack_490 = fStack_3d0 * fVar254 - (fVar189 * fStack_3c0 + fVar274);
          fStack_48c = fStack_3cc * fVar255 - (fVar142 * fStack_3bc + fVar276);
          local_2e8 = ((float)local_418._0_4_ * fVar225 + (float)local_2d8._0_4_) * local_2e8;
          fStack_2e4 = ((float)local_418._4_4_ * fVar226 + (float)local_2d8._4_4_) * fStack_2e4;
          fStack_2e0 = (fStack_410 * fVar227 + fStack_2d0) * fStack_2e0;
          fStack_2dc = (fStack_40c * fVar241 + fStack_2cc) * fStack_2dc;
          fVar190 = local_318 * fVar225 - ((float)local_408._0_4_ * local_2e8 + fVar278);
          fVar197 = fStack_314 * fVar226 - ((float)local_408._4_4_ * fStack_2e4 + fVar282);
          fVar198 = fStack_310 * fVar227 - (fStack_400 * fStack_2e0 + fVar284);
          fVar199 = fStack_30c * fVar241 - (fStack_3fc * fStack_2dc + fVar285);
          fVar129 = local_3e8 * fVar225 - (local_398 * local_2e8 + fVar286);
          fVar188 = fStack_3e4 * fVar226 - (fStack_394 * fStack_2e4 + fVar290);
          fVar189 = fStack_3e0 * fVar227 - (fStack_390 * fStack_2e0 + fVar291);
          fVar142 = fStack_3dc * fVar241 - (fStack_38c * fStack_2dc + fVar292);
          bVar8 = 0.0 <= auVar222._0_4_;
          uVar60 = -(uint)bVar8;
          bVar58 = 0.0 <= auVar222._4_4_;
          uVar62 = -(uint)bVar58;
          bVar9 = 0.0 <= auVar222._8_4_;
          uVar64 = -(uint)bVar9;
          bVar10 = 0.0 <= auVar222._12_4_;
          uVar67 = -(uint)bVar10;
          auVar196._0_4_ = local_3d8 * fVar225 - (local_2e8 * local_3c8 + fVar270);
          auVar196._4_4_ = fStack_3d4 * fVar226 - (fStack_2e4 * fStack_3c4 + fVar272);
          auVar196._8_4_ = fStack_3d0 * fVar227 - (fStack_2e0 * fStack_3c0 + fVar274);
          auVar196._12_4_ = fStack_3cc * fVar241 - (fStack_2dc * fStack_3bc + fVar276);
          auVar250._0_4_ = (uint)fVar242 & uVar60;
          auVar250._4_4_ = (uint)fVar243 & uVar62;
          auVar250._8_4_ = (uint)fVar254 & uVar64;
          auVar250._12_4_ = (uint)fVar255 & uVar67;
          auVar235._0_8_ = CONCAT44(~uVar62,~uVar60) & 0x7f8000007f800000;
          auVar235._8_4_ = ~uVar64 & 0x7f800000;
          auVar235._12_4_ = ~uVar67 & 0x7f800000;
          auVar235 = auVar235 | auVar250;
          auVar164._0_4_ = (uint)fVar225 & uVar60;
          auVar164._4_4_ = (uint)fVar226 & uVar62;
          auVar164._8_4_ = (uint)fVar227 & uVar64;
          auVar164._12_4_ = (uint)fVar241 & uVar67;
          auVar119._0_8_ = CONCAT44(~uVar62,~uVar60) & 0xff800000ff800000;
          auVar119._8_4_ = ~uVar64 & 0xff800000;
          auVar119._12_4_ = ~uVar67 & 0xff800000;
          auVar119 = auVar119 | auVar164;
          auVar98._0_8_ = CONCAT44(fStack_224,local_228) & 0x7fffffff7fffffff;
          auVar98._8_4_ = ABS(fStack_220);
          auVar98._12_4_ = ABS(fStack_21c);
          auVar29._4_4_ = fStack_284;
          auVar29._0_4_ = local_288;
          auVar29._8_4_ = fStack_280;
          auVar29._12_4_ = fStack_27c;
          auVar79 = maxps(auVar29,auVar98);
          fVar225 = auVar79._0_4_ * 1.9073486e-06;
          fVar226 = auVar79._4_4_ * 1.9073486e-06;
          fVar227 = auVar79._8_4_ * 1.9073486e-06;
          fVar241 = auVar79._12_4_ * 1.9073486e-06;
          auVar165._0_4_ = -(uint)(ABS((float)local_328._0_4_) < fVar225 && bVar8);
          auVar165._4_4_ = -(uint)(ABS((float)local_328._4_4_) < fVar226 && bVar58);
          auVar165._8_4_ = -(uint)(ABS(fStack_320) < fVar227 && bVar9);
          auVar165._12_4_ = -(uint)(ABS(fStack_31c) < fVar241 && bVar10);
          iVar46 = movmskps(iVar46,auVar165);
          local_548 = fVar141;
          fStack_544 = fVar143;
          fStack_540 = fVar155;
          fStack_53c = fVar156;
          if (iVar46 != 0) {
            uVar60 = -(uint)(fVar110 <= 0.0);
            uVar62 = -(uint)(fVar126 <= 0.0);
            uVar64 = -(uint)(fVar128 <= 0.0);
            uVar67 = -(uint)(fVar140 <= 0.0);
            auVar257._0_4_ = (uVar60 & 0xff800000 | ~uVar60 & 0x7f800000) & auVar165._0_4_;
            auVar257._4_4_ = (uVar62 & 0xff800000 | ~uVar62 & 0x7f800000) & auVar165._4_4_;
            auVar257._8_4_ = (uVar64 & 0xff800000 | ~uVar64 & 0x7f800000) & auVar165._8_4_;
            auVar257._12_4_ = (uVar67 & 0xff800000 | ~uVar67 & 0x7f800000) & auVar165._12_4_;
            auVar253._0_4_ = ~auVar165._0_4_ & auVar235._0_4_;
            auVar253._4_4_ = ~auVar165._4_4_ & auVar235._4_4_;
            auVar253._8_4_ = ~auVar165._8_4_ & auVar235._8_4_;
            auVar253._12_4_ = ~auVar165._12_4_ & auVar235._12_4_;
            auVar235 = auVar253 | auVar257;
            auVar258._0_4_ = (uVar60 & 0x7f800000 | ~uVar60 & 0xff800000) & auVar165._0_4_;
            auVar258._4_4_ = (uVar62 & 0x7f800000 | ~uVar62 & 0xff800000) & auVar165._4_4_;
            auVar258._8_4_ = (uVar64 & 0x7f800000 | ~uVar64 & 0xff800000) & auVar165._8_4_;
            auVar258._12_4_ = (uVar67 & 0x7f800000 | ~uVar67 & 0xff800000) & auVar165._12_4_;
            auVar175._0_4_ = ~auVar165._0_4_ & auVar119._0_4_;
            auVar175._4_4_ = ~auVar165._4_4_ & auVar119._4_4_;
            auVar175._8_4_ = ~auVar165._8_4_ & auVar119._8_4_;
            auVar175._12_4_ = ~auVar165._12_4_ & auVar119._12_4_;
            auVar119 = auVar175 | auVar258;
            local_428._4_4_ =
                 -(uint)((fVar226 <= ABS((float)local_328._4_4_) || fVar126 <= 0.0) && bVar58);
            local_428._0_4_ =
                 -(uint)((fVar225 <= ABS((float)local_328._0_4_) || fVar110 <= 0.0) && bVar8);
            fStack_420 = (float)-(uint)((fVar227 <= ABS(fStack_320) || fVar128 <= 0.0) && bVar9);
            fStack_41c = (float)-(uint)((fVar241 <= ABS(fStack_31c) || fVar140 <= 0.0) && bVar10);
          }
        }
        fVar110 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar126 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar128 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_408._4_4_ =
             -(uint)(0.3 <= ABS(fVar197 * fVar110 + fVar188 * fVar126 + auVar196._4_4_ * fVar128));
        local_408._0_4_ =
             -(uint)(0.3 <= ABS(fVar190 * fVar110 + fVar129 * fVar126 + auVar196._0_4_ * fVar128));
        fStack_400 = (float)-(uint)(0.3 <= ABS(fVar198 * fVar110 +
                                               fVar189 * fVar126 + auVar196._8_4_ * fVar128));
        fStack_3fc = (float)-(uint)(0.3 <= ABS(fVar199 * fVar110 +
                                               fVar142 * fVar126 + auVar196._12_4_ * fVar128));
        _local_118 = local_3b8;
        local_108 = minps(local_248,auVar235);
        _local_258 = maxps(local_3b8,auVar119);
        local_328._0_4_ = -(uint)(fVar127 <= local_108._0_4_) & uVar61;
        local_328._4_4_ = -(uint)(fVar69 <= local_108._4_4_) & uVar63;
        fStack_320 = (float)(-(uint)(fVar108 <= local_108._8_4_) & uVar65);
        fStack_31c = (float)(-(uint)(fVar109 <= local_108._12_4_) & uVar66);
        local_2f8 = _local_328;
        _local_418 = _local_258;
        local_308._0_4_ = -(uint)(local_258._0_4_ <= local_248._0_4_) & uVar61;
        local_308._4_4_ = -(uint)(local_258._4_4_ <= local_248._4_4_) & uVar63;
        local_308._8_4_ = -(uint)(local_258._8_4_ <= local_248._8_4_) & uVar65;
        local_308._12_4_ = -(uint)(local_258._12_4_ <= local_248._12_4_) & uVar66;
        _local_2d8 = local_308;
        iVar46 = movmskps(iVar46,local_308 | _local_328);
        if (iVar46 != 0) {
          local_2e8 = (float)(int)local_4a0;
          fStack_2e4 = (float)(int)local_4a0;
          fStack_2e0 = (float)(int)local_4a0;
          fStack_2dc = (float)(int)local_4a0;
          local_498._0_4_ =
               -(uint)((int)local_4a0 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_498._0_4_ * fVar128 +
                                                 fVar157 * fVar126 + fVar141 * fVar110)) &
                             local_428._0_4_) << 0x1f) >> 0x1f) + 4);
          local_498._4_4_ =
               -(uint)((int)local_4a0 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_498._4_4_ * fVar128 +
                                                 fVar176 * fVar126 + fVar143 * fVar110)) &
                             local_428._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_490 = (float)-(uint)((int)local_4a0 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_490 * fVar128 +
                                                                fVar177 * fVar126 +
                                                                fVar155 * fVar110)) &
                                            (uint)fStack_420) << 0x1f) >> 0x1f) + 4);
          fStack_48c = (float)-(uint)((int)local_4a0 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_48c * fVar128 +
                                                                fVar178 * fVar126 +
                                                                fVar156 * fVar110)) &
                                            (uint)fStack_41c) << 0x1f) >> 0x1f) + 4);
          local_2f8 = ~_local_498 & _local_328;
          iVar46 = movmskps(iVar46,local_2f8);
          fStack_4b4 = local_528;
          fStack_4b0 = fStack_524;
          fStack_4ac = fStack_520;
          if (iVar46 != 0) {
            local_3c8 = local_3a8 + fVar127;
            fStack_3c4 = fStack_3a4 + fVar69;
            fStack_3c0 = fStack_3a0 + fVar108;
            fStack_3bc = fStack_39c + fVar109;
            do {
              auVar245 = ~local_2f8 & _DAT_01feb9f0 | local_2f8 & local_3b8;
              auVar148._4_4_ = auVar245._0_4_;
              auVar148._0_4_ = auVar245._4_4_;
              auVar148._8_4_ = auVar245._12_4_;
              auVar148._12_4_ = auVar245._8_4_;
              auVar79 = minps(auVar148,auVar245);
              auVar120._0_8_ = auVar79._8_8_;
              auVar120._8_4_ = auVar79._0_4_;
              auVar120._12_4_ = auVar79._4_4_;
              auVar79 = minps(auVar120,auVar79);
              auVar121._0_8_ =
                   CONCAT44(-(uint)(auVar79._4_4_ == auVar245._4_4_) & local_2f8._4_4_,
                            -(uint)(auVar79._0_4_ == auVar245._0_4_) & local_2f8._0_4_);
              auVar121._8_4_ = -(uint)(auVar79._8_4_ == auVar245._8_4_) & local_2f8._8_4_;
              auVar121._12_4_ = -(uint)(auVar79._12_4_ == auVar245._12_4_) & local_2f8._12_4_;
              iVar46 = movmskps(iVar46,auVar121);
              auVar99 = local_2f8;
              if (iVar46 != 0) {
                auVar99._8_4_ = auVar121._8_4_;
                auVar99._0_8_ = auVar121._0_8_;
                auVar99._12_4_ = auVar121._12_4_;
              }
              uVar47 = movmskps(iVar46,auVar99);
              pRVar50 = (RayHit *)0x0;
              if (CONCAT44(uVar52,uVar47) != 0) {
                for (; (CONCAT44(uVar52,uVar47) >> (long)pRVar50 & 1) == 0;
                    pRVar50 = (RayHit *)((long)(pRVar50->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_2f8 + (long)pRVar50 * 4) = 0;
              fVar127 = *(float *)(local_2a8 + (long)pRVar50 * 4);
              auVar223 = ZEXT416(*(uint *)(local_118 + (long)pRVar50 * 4));
              local_558 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fStack_554 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fStack_550 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fStack_54c = (ray->super_RayK<1>).dir.field_0.m128[3];
              fVar69 = fStack_550 * fStack_550 + fStack_554 * fStack_554 + local_558 * local_558;
              if (fVar69 < 0.0) {
                fVar69 = sqrtf(fVar69);
                pRVar50 = extraout_RAX;
              }
              else {
                fVar69 = SQRT(fVar69);
              }
              auVar19._4_4_ = fStack_4f4;
              auVar19._0_4_ = local_4f8;
              auVar19._8_4_ = fStack_4f0;
              auVar19._12_4_ = fStack_4ec;
              auVar25._4_4_ = fStack_464;
              auVar25._0_4_ = local_468;
              auVar25._8_4_ = fStack_460;
              auVar25._12_4_ = fStack_45c;
              auVar245 = minps(auVar19,auVar25);
              auVar219 = maxps(auVar19,auVar25);
              auVar23._4_4_ = fStack_474;
              auVar23._0_4_ = local_478;
              auVar23._8_4_ = fStack_470;
              auVar23._12_4_ = fStack_46c;
              auVar21._4_4_ = fStack_484;
              auVar21._0_4_ = local_488;
              auVar21._8_4_ = fStack_480;
              auVar21._12_4_ = fStack_47c;
              auVar79 = minps(auVar23,auVar21);
              auVar245 = minps(auVar245,auVar79);
              auVar79 = maxps(auVar23,auVar21);
              auVar79 = maxps(auVar219,auVar79);
              auVar166._0_8_ = auVar245._0_8_ & 0x7fffffff7fffffff;
              auVar166._8_4_ = auVar245._8_4_ & 0x7fffffff;
              auVar166._12_4_ = auVar245._12_4_ & 0x7fffffff;
              local_398 = auVar79._12_4_;
              auVar100._0_8_ = auVar79._0_8_ & 0x7fffffff7fffffff;
              auVar100._8_4_ = auVar79._8_4_ & 0x7fffffff;
              auVar100._12_4_ = ABS(local_398);
              auVar79 = maxps(auVar166,auVar100);
              fVar108 = auVar79._4_4_;
              if (auVar79._4_4_ <= auVar79._0_4_) {
                fVar108 = auVar79._0_4_;
              }
              auVar167._8_8_ = auVar79._8_8_;
              auVar167._0_8_ = auVar79._8_8_;
              if (auVar79._8_4_ <= fVar108) {
                auVar167._0_4_ = fVar108;
              }
              register0x00001304 = auVar167._4_12_;
              local_568._0_4_ = auVar167._0_4_ * 1.9073486e-06;
              local_368 = fVar69 * 1.9073486e-06;
              fStack_394 = local_398;
              fStack_390 = local_398;
              fStack_38c = local_398;
              lVar48 = 4;
              do {
                fVar69 = 1.0 - fVar127;
                fVar128 = local_468 * fVar69 + local_478 * fVar127;
                fVar141 = fStack_464 * fVar69 + fStack_474 * fVar127;
                fVar143 = fStack_460 * fVar69 + fStack_470 * fVar127;
                fVar155 = fStack_45c * fVar69 + fStack_46c * fVar127;
                fVar108 = (local_4f8 * fVar69 + local_468 * fVar127) * fVar69 + fVar127 * fVar128;
                fVar109 = (fStack_4f4 * fVar69 + fStack_464 * fVar127) * fVar69 + fVar127 * fVar141;
                fVar110 = (fStack_4f0 * fVar69 + fStack_460 * fVar127) * fVar69 + fVar127 * fVar143;
                fVar126 = (fStack_4ec * fVar69 + fStack_45c * fVar127) * fVar69 + fVar127 * fVar155;
                fVar140 = fVar128 * fVar69 + (local_478 * fVar69 + local_488 * fVar127) * fVar127;
                fVar141 = fVar141 * fVar69 + (fStack_474 * fVar69 + fStack_484 * fVar127) * fVar127;
                fVar143 = fVar143 * fVar69 + (fStack_470 * fVar69 + fStack_480 * fVar127) * fVar127;
                fVar155 = fVar155 * fVar69 + (fStack_46c * fVar69 + fStack_47c * fVar127) * fVar127;
                fVar128 = auVar223._0_4_;
                local_348._0_4_ = fVar69 * fVar108 + fVar127 * fVar140;
                local_348._4_4_ = fVar69 * fVar109 + fVar127 * fVar141;
                fStack_340 = fVar69 * fVar110 + fVar127 * fVar143;
                fStack_33c = fVar69 * fVar126 + fVar127 * fVar155;
                fVar140 = (fVar140 - fVar108) * 3.0;
                fVar141 = (fVar141 - fVar109) * 3.0;
                fVar143 = (fVar143 - fVar110) * 3.0;
                fVar126 = (fVar155 - fVar126) * 3.0;
                local_548 = (fVar128 * local_558 + 0.0) - (float)local_348._0_4_;
                fStack_544 = (fVar128 * fStack_554 + 0.0) - (float)local_348._4_4_;
                fStack_540 = (fVar128 * fStack_550 + 0.0) - fStack_340;
                fStack_53c = (fVar128 * fStack_54c + 0.0) - fStack_33c;
                fVar108 = fStack_544 * fStack_544;
                fVar109 = fStack_540 * fStack_540;
                fVar110 = fStack_53c * fStack_53c;
                auVar251._0_4_ = fVar108 + local_548 * local_548 + fVar109;
                auVar251._4_4_ = fVar108 + fVar108 + fVar110;
                auVar251._8_4_ = fVar108 + fVar109 + fVar109;
                auVar251._12_4_ = fVar108 + fVar110 + fVar110;
                local_358 = auVar251._0_4_;
                if (auVar251._0_4_ < 0.0) {
                  local_588 = ZEXT416((uint)fVar69);
                  fVar108 = sqrtf(auVar251._0_4_);
                  pRVar51 = extraout_RAX_00;
                  fVar69 = (float)local_588._0_4_;
                }
                else {
                  fVar108 = SQRT(auVar251._0_4_);
                  pRVar51 = pRVar50;
                }
                fVar155 = fVar69 * 6.0;
                fVar109 = (fVar127 - (fVar69 + fVar69)) * 6.0;
                fVar110 = (fVar69 - (fVar127 + fVar127)) * 6.0;
                fVar69 = fVar127 * 6.0;
                fVar156 = fVar155 * local_4f8 +
                          fVar109 * local_468 + fVar110 * local_478 + fVar69 * local_488;
                fVar157 = fVar155 * fStack_4f4 +
                          fVar109 * fStack_464 + fVar110 * fStack_474 + fVar69 * fStack_484;
                fVar176 = fVar155 * fStack_4f0 +
                          fVar109 * fStack_460 + fVar110 * fStack_470 + fVar69 * fStack_480;
                local_4b8 = (float)local_568._0_4_;
                if ((float)local_568._0_4_ <= local_368 * fVar128) {
                  local_4b8 = local_368 * fVar128;
                }
                fVar177 = fVar141 * fVar141 + fVar140 * fVar140 + fVar143 * fVar143;
                auVar245 = ZEXT416((uint)fVar177);
                auVar79 = rsqrtss(ZEXT416((uint)fVar177),auVar245);
                fVar178 = auVar79._0_4_;
                fVar178 = fVar178 * fVar178 * fVar177 * -0.5 * fVar178 + fVar178 * 1.5;
                fVar129 = fVar143 * fVar176 + fVar141 * fVar157 + fVar140 * fVar156;
                auVar79 = rcpss(auVar245,auVar245);
                fVar188 = (2.0 - fVar177 * auVar79._0_4_) * auVar79._0_4_;
                local_528 = fVar188 * (fVar177 * fVar156 - fVar129 * fVar140) * fVar178;
                fStack_524 = fVar188 * (fVar177 * fVar157 - fVar129 * fVar141) * fVar178;
                fStack_520 = fVar188 * (fVar177 * fVar176 - fVar129 * fVar143) * fVar178;
                fStack_51c = fVar188 * (fVar177 * (fVar155 * fStack_4ec +
                                                  fVar109 * fStack_45c +
                                                  fVar110 * fStack_46c + fVar69 * fStack_47c) -
                                       fVar129 * fVar126) * fVar178;
                fStack_4b4 = (float)local_568._4_4_;
                fStack_4b0 = fStack_560;
                fStack_4ac = fStack_55c;
                if (fVar177 < 0.0) {
                  local_588._0_4_ = fVar108;
                  local_518 = fVar140 * fVar178;
                  fStack_514 = fVar141 * fVar178;
                  fStack_510 = fVar143 * fVar178;
                  fStack_50c = fVar126 * fVar178;
                  local_508 = -fVar140;
                  fStack_504 = -fVar141;
                  fStack_500 = -fVar143;
                  fStack_4fc = -fVar126;
                  fVar177 = sqrtf(fVar177);
                  pRVar51 = extraout_RAX_01;
                  fVar69 = local_518;
                  fVar110 = fStack_514;
                  fVar155 = fStack_510;
                  fVar109 = fStack_50c;
                  fVar156 = local_508;
                  fVar157 = fStack_504;
                  fVar176 = fStack_500;
                  fVar178 = fStack_4fc;
                  fVar108 = (float)local_588._0_4_;
                }
                else {
                  fVar177 = SQRT(fVar177);
                  fVar69 = fVar140 * fVar178;
                  fVar110 = fVar141 * fVar178;
                  fVar155 = fVar143 * fVar178;
                  fVar109 = fVar126 * fVar178;
                  fVar156 = -fVar140;
                  fVar157 = -fVar141;
                  fVar176 = -fVar143;
                  fVar178 = -fVar126;
                }
                fVar129 = fStack_544 * fVar110;
                fVar142 = fStack_540 * fVar155;
                fVar190 = fStack_53c * fVar109;
                fVar188 = fVar129 + local_548 * fVar69 + fVar142;
                fVar197 = fVar129 + fVar129 + fVar190;
                fVar142 = fVar129 + fVar142 + fVar142;
                fVar190 = fVar129 + fVar190 + fVar190;
                fVar129 = (fVar108 + 1.0) * ((float)local_568._0_4_ / fVar177) +
                          fVar108 * (float)local_568._0_4_ + local_4b8;
                fVar177 = fStack_54c * fVar109;
                fVar109 = fVar109 * fVar178;
                fVar108 = fVar155 * fVar176 + fVar110 * fVar157 + fVar69 * fVar156 +
                          fStack_520 * fStack_540 + fStack_524 * fStack_544 + local_528 * local_548;
                fVar69 = fStack_550 * fVar155 + fStack_554 * fVar110 + local_558 * fVar69;
                fVar189 = auVar251._0_4_ - fVar188 * fVar188;
                auVar101._0_8_ = CONCAT44(auVar251._4_4_ - fVar197 * fVar197,fVar189);
                auVar101._8_4_ = auVar251._8_4_ - fVar142 * fVar142;
                auVar101._12_4_ = auVar251._12_4_ - fVar190 * fVar190;
                fVar178 = fVar178 * fStack_53c;
                fVar110 = (fVar176 * fStack_540 + fVar157 * fStack_544 + fVar156 * local_548) -
                          fVar188 * fVar108;
                fStack_520 = fStack_550 * fStack_540;
                fStack_524 = fStack_54c * fStack_53c;
                local_528 = (fStack_520 + fStack_554 * fStack_544 + local_558 * local_548) -
                            fVar188 * fVar69;
                auVar149._8_4_ = auVar101._8_4_;
                auVar149._0_8_ = auVar101._0_8_;
                auVar149._12_4_ = auVar101._12_4_;
                auVar79 = rsqrtss(auVar149,auVar101);
                fVar156 = auVar79._0_4_;
                auVar150._4_12_ = auVar79._4_12_;
                auVar150._0_4_ = fVar156 * fVar156 * fVar189 * -0.5 * fVar156 + fVar156 * 1.5;
                fStack_51c = fStack_524;
                if (fVar189 < 0.0) {
                  local_588._0_4_ = fVar129;
                  _local_538 = auVar150;
                  local_518 = fVar108;
                  fStack_514 = fVar109;
                  fStack_510 = fVar155 * fVar176;
                  fStack_50c = fVar109;
                  local_508 = fVar110;
                  fStack_504 = fVar178;
                  fStack_500 = fVar176 * fStack_540;
                  fStack_4fc = fVar178;
                  local_388 = fVar69;
                  fStack_384 = fVar177;
                  fStack_380 = fStack_550 * fVar155;
                  fStack_37c = fVar177;
                  local_378 = fVar188;
                  fStack_374 = fVar197;
                  fStack_370 = fVar142;
                  fStack_36c = fVar190;
                  fVar189 = sqrtf(fVar189);
                  pRVar51 = extraout_RAX_02;
                  auVar150 = _local_538;
                  fVar108 = local_518;
                  fVar109 = fStack_514;
                  fVar69 = local_388;
                  fVar177 = fStack_384;
                  fVar110 = local_508;
                  fVar178 = fStack_504;
                  fVar129 = (float)local_588._0_4_;
                  fVar188 = local_378;
                }
                else {
                  fVar189 = SQRT(fVar189);
                }
                fVar189 = fVar189 - fStack_33c;
                fVar110 = fVar110 * auVar150._0_4_ - fVar126;
                auVar17._4_4_ = fStack_524;
                auVar17._0_4_ = local_528;
                auVar17._8_4_ = fStack_520;
                auVar17._12_4_ = fStack_51c;
                auVar130._4_12_ = auVar17._4_12_;
                auVar130._0_4_ = local_528 * auVar150._0_4_;
                auVar237._0_8_ = CONCAT44(fVar178,fVar110) ^ 0x8000000080000000;
                auVar237._8_4_ = -fVar178;
                auVar237._12_4_ = fVar109;
                auVar236._8_8_ = auVar237._8_8_;
                auVar236._0_8_ = CONCAT44(fVar108,fVar110) ^ 0x80000000;
                fVar108 = fVar108 * auVar130._0_4_ - fVar69 * fVar110;
                auVar132._0_8_ = auVar130._0_8_;
                auVar132._8_4_ = fStack_524;
                auVar132._12_4_ = -fVar177;
                auVar131._8_8_ = auVar132._8_8_;
                auVar131._0_8_ = CONCAT44(fVar69,auVar130._0_4_) ^ 0x8000000000000000;
                auVar12._4_4_ = fVar108;
                auVar12._0_4_ = fVar108;
                auVar12._8_4_ = fVar108;
                auVar12._12_4_ = fVar108;
                auVar79 = divps(auVar131,auVar12);
                auVar13._4_4_ = fVar108;
                auVar13._0_4_ = fVar108;
                auVar13._8_4_ = fVar108;
                auVar13._12_4_ = fVar108;
                auVar245 = divps(auVar236,auVar13);
                fVar127 = fVar127 - (auVar79._4_4_ * fVar189 + auVar79._0_4_ * fVar188);
                auVar223._0_4_ = fVar128 - (auVar245._4_4_ * fVar189 + auVar245._0_4_ * fVar188);
                if (fVar129 <= ABS(fVar188)) {
                  bVar8 = false;
                }
                else if (local_398 * 1.9073486e-06 + local_4b8 + fVar129 <= ABS(fVar189)) {
                  bVar8 = false;
                }
                else {
                  auVar223._0_4_ = auVar223._0_4_ + (float)local_2c8._0_4_;
                  bVar8 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= auVar223._0_4_) &&
                       (fVar69 = (ray->super_RayK<1>).tfar, auVar223._0_4_ <= fVar69)) &&
                      (0.0 <= fVar127)) && (fVar127 <= 1.0)) {
                    auVar79 = rsqrtss(auVar251,auVar251);
                    fVar108 = auVar79._0_4_;
                    pGVar6 = (context->scene->geometries).items[(long)local_570].ptr;
                    uVar61 = (ray->super_RayK<1>).mask;
                    pRVar51 = (RayHit *)(ulong)uVar61;
                    pRVar53 = local_570;
                    if ((pGVar6->mask & uVar61) != 0) {
                      fVar108 = fVar108 * 1.5 + fVar108 * fVar108 * local_358 * -0.5 * fVar108;
                      fVar128 = local_548 * fVar108;
                      fVar156 = fStack_544 * fVar108;
                      fVar108 = fStack_540 * fVar108;
                      fVar110 = fVar126 * fVar128 + fVar140;
                      fVar109 = fVar126 * fVar156 + fVar141;
                      fVar126 = fVar126 * fVar108 + fVar143;
                      fVar155 = fVar156 * fVar140 - fVar141 * fVar128;
                      fVar141 = fVar108 * fVar141 - fVar143 * fVar156;
                      fVar128 = fVar128 * fVar143 - fVar140 * fVar108;
                      fVar108 = fVar109 * fVar141 - fVar128 * fVar110;
                      fVar109 = fVar126 * fVar128 - fVar155 * fVar109;
                      fVar110 = fVar110 * fVar155 - fVar141 * fVar126;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = auVar223._0_4_;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar110,fVar109);
                        (ray->Ng).field_0.field_0.z = fVar108;
                        ray->u = fVar127;
                        ray->v = 0.0;
                        ray->primID = uVar59;
                        ray->geomID = (uint)local_570;
                        ray->instID[0] = context->user->instID[0];
                        uVar61 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar61;
                        pRVar51 = (RayHit *)(ulong)uVar61;
                      }
                      else {
                        local_458 = CONCAT44(fVar110,fVar109);
                        fStack_450 = fVar108;
                        fStack_44c = fVar127;
                        local_448 = 0;
                        local_444 = uVar59;
                        local_440 = (uint)local_570;
                        local_43c = context->user->instID[0];
                        pRVar53 = (RTCIntersectArguments *)(ulong)local_43c;
                        local_438 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = auVar223._0_4_;
                        local_58c = 0xffffffff;
                        local_4e8.geometryUserPtr = pGVar6->userPtr;
                        local_4e8.valid = &local_58c;
                        local_4e8.context = context->user;
                        local_4e8.hit = (RTCHitN *)&local_458;
                        local_4e8.N = 1;
                        local_4e8.ray = (RTCRayN *)ray;
                        if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00afa26b:
                          pRVar53 = context->args;
                          if (pRVar53->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar53->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar53->filter)(&local_4e8);
                            }
                            if ((((RayK<1> *)local_4e8.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00afa313;
                          }
                          (((Vec3f *)((long)local_4e8.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_4e8.hit;
                          (((Vec3f *)((long)local_4e8.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_4e8.hit + 4);
                          (((Vec3f *)((long)local_4e8.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_4e8.hit + 8);
                          *(float *)((long)local_4e8.ray + 0x3c) = *(float *)(local_4e8.hit + 0xc);
                          *(float *)((long)local_4e8.ray + 0x40) = *(float *)(local_4e8.hit + 0x10);
                          *(float *)((long)local_4e8.ray + 0x44) = *(float *)(local_4e8.hit + 0x14);
                          *(float *)((long)local_4e8.ray + 0x48) = *(float *)(local_4e8.hit + 0x18);
                          *(float *)((long)local_4e8.ray + 0x4c) = *(float *)(local_4e8.hit + 0x1c);
                          pRVar53 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_4e8.hit + 0x20);
                          *(float *)((long)local_4e8.ray + 0x50) = *(float *)(local_4e8.hit + 0x20);
                          pRVar51 = (RayHit *)local_4e8.ray;
                        }
                        else {
                          (*pGVar6->intersectionFilterN)(&local_4e8);
                          if ((((RayK<1> *)local_4e8.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00afa26b;
LAB_00afa313:
                          (ray->super_RayK<1>).tfar = fVar69;
                          pRVar51 = (RayHit *)local_4e8.valid;
                        }
                      }
                    }
                  }
                }
                bVar58 = lVar48 == 0;
                lVar48 = lVar48 + -1;
                pRVar50 = (RayHit *)CONCAT71((int7)((ulong)pRVar51 >> 8),bVar58);
              } while ((!bVar8) && (!bVar58));
              fVar127 = (ray->super_RayK<1>).tfar;
              local_2f8._0_4_ = -(uint)(local_3c8 <= fVar127) & local_2f8._0_4_;
              local_2f8._4_4_ = -(uint)(fStack_3c4 <= fVar127) & local_2f8._4_4_;
              local_2f8._8_4_ = -(uint)(fStack_3c0 <= fVar127) & local_2f8._8_4_;
              local_2f8._12_4_ = -(uint)(fStack_3bc <= fVar127) & local_2f8._12_4_;
              uVar52 = (undefined4)((ulong)pRVar51 >> 0x20);
              iVar46 = movmskps((int)pRVar50,local_2f8);
            } while (iVar46 != 0);
          }
          fVar127 = (ray->super_RayK<1>).tfar;
          local_418._0_4_ = -(uint)((float)local_418._0_4_ + local_3a8 <= fVar127) & local_2d8._0_4_
          ;
          local_418._4_4_ =
               -(uint)((float)local_418._4_4_ + fStack_3a4 <= fVar127) & local_2d8._4_4_;
          fStack_410 = (float)(-(uint)(fStack_410 + fStack_3a0 <= fVar127) & (uint)fStack_2d0);
          fStack_40c = (float)(-(uint)(fStack_40c + fStack_39c <= fVar127) & (uint)fStack_2cc);
          local_408._0_4_ =
               -(uint)((int)local_2e8 <
                      ((int)((local_408._0_4_ & local_428._0_4_) << 0x1f) >> 0x1f) + 4);
          local_408._4_4_ =
               -(uint)((int)fStack_2e4 <
                      ((int)((local_408._4_4_ & local_428._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_400 = (float)-(uint)((int)fStack_2e0 <
                                     ((int)(((uint)fStack_400 & (uint)fStack_420) << 0x1f) >> 0x1f)
                                     + 4);
          fStack_3fc = (float)-(uint)((int)fStack_2dc <
                                     ((int)(((uint)fStack_3fc & (uint)fStack_41c) << 0x1f) >> 0x1f)
                                     + 4);
          local_308 = ~_local_408 & _local_418;
          iVar46 = movmskps(iVar46,local_308);
          if (iVar46 != 0) {
            local_3b8 = _local_258;
            local_3c8 = local_3a8 + (float)local_258._0_4_;
            fStack_3c4 = fStack_3a4 + (float)local_258._4_4_;
            fStack_3c0 = fStack_3a0 + fStack_250;
            fStack_3bc = fStack_39c + fStack_24c;
            do {
              auVar245 = ~local_308 & _DAT_01feb9f0 | local_308 & local_3b8;
              auVar151._4_4_ = auVar245._0_4_;
              auVar151._0_4_ = auVar245._4_4_;
              auVar151._8_4_ = auVar245._12_4_;
              auVar151._12_4_ = auVar245._8_4_;
              auVar79 = minps(auVar151,auVar245);
              auVar122._0_8_ = auVar79._8_8_;
              auVar122._8_4_ = auVar79._0_4_;
              auVar122._12_4_ = auVar79._4_4_;
              auVar79 = minps(auVar122,auVar79);
              auVar123._0_8_ =
                   CONCAT44(-(uint)(auVar79._4_4_ == auVar245._4_4_) & local_308._4_4_,
                            -(uint)(auVar79._0_4_ == auVar245._0_4_) & local_308._0_4_);
              auVar123._8_4_ = -(uint)(auVar79._8_4_ == auVar245._8_4_) & local_308._8_4_;
              auVar123._12_4_ = -(uint)(auVar79._12_4_ == auVar245._12_4_) & local_308._12_4_;
              iVar46 = movmskps(iVar46,auVar123);
              auVar102 = local_308;
              if (iVar46 != 0) {
                auVar102._8_4_ = auVar123._8_4_;
                auVar102._0_8_ = auVar123._0_8_;
                auVar102._12_4_ = auVar123._12_4_;
              }
              uVar47 = movmskps(iVar46,auVar102);
              pRVar50 = (RayHit *)0x0;
              if (CONCAT44(uVar52,uVar47) != 0) {
                for (; (CONCAT44(uVar52,uVar47) >> (long)pRVar50 & 1) == 0;
                    pRVar50 = (RayHit *)((long)(pRVar50->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_308 + (long)pRVar50 * 4) = 0;
              fVar127 = local_2b8[(long)pRVar50];
              auVar224 = ZEXT416(*(uint *)(local_248 + (long)pRVar50 * 4));
              local_558 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fStack_554 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fStack_550 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fStack_54c = (ray->super_RayK<1>).dir.field_0.m128[3];
              fVar69 = fStack_550 * fStack_550 + fStack_554 * fStack_554 + local_558 * local_558;
              if (fVar69 < 0.0) {
                fVar69 = sqrtf(fVar69);
                pRVar50 = extraout_RAX_03;
              }
              else {
                fVar69 = SQRT(fVar69);
              }
              auVar20._4_4_ = fStack_4f4;
              auVar20._0_4_ = local_4f8;
              auVar20._8_4_ = fStack_4f0;
              auVar20._12_4_ = fStack_4ec;
              auVar26._4_4_ = fStack_464;
              auVar26._0_4_ = local_468;
              auVar26._8_4_ = fStack_460;
              auVar26._12_4_ = fStack_45c;
              auVar245 = minps(auVar20,auVar26);
              auVar219 = maxps(auVar20,auVar26);
              auVar24._4_4_ = fStack_474;
              auVar24._0_4_ = local_478;
              auVar24._8_4_ = fStack_470;
              auVar24._12_4_ = fStack_46c;
              auVar22._4_4_ = fStack_484;
              auVar22._0_4_ = local_488;
              auVar22._8_4_ = fStack_480;
              auVar22._12_4_ = fStack_47c;
              auVar79 = minps(auVar24,auVar22);
              auVar245 = minps(auVar245,auVar79);
              auVar79 = maxps(auVar24,auVar22);
              auVar79 = maxps(auVar219,auVar79);
              auVar168._0_8_ = auVar245._0_8_ & 0x7fffffff7fffffff;
              auVar168._8_4_ = auVar245._8_4_ & 0x7fffffff;
              auVar168._12_4_ = auVar245._12_4_ & 0x7fffffff;
              local_398 = auVar79._12_4_;
              auVar103._0_8_ = auVar79._0_8_ & 0x7fffffff7fffffff;
              auVar103._8_4_ = auVar79._8_4_ & 0x7fffffff;
              auVar103._12_4_ = ABS(local_398);
              auVar79 = maxps(auVar168,auVar103);
              fVar108 = auVar79._4_4_;
              if (auVar79._4_4_ <= auVar79._0_4_) {
                fVar108 = auVar79._0_4_;
              }
              auVar169._8_8_ = auVar79._8_8_;
              auVar169._0_8_ = auVar79._8_8_;
              if (auVar79._8_4_ <= fVar108) {
                auVar169._0_4_ = fVar108;
              }
              register0x00001304 = auVar169._4_12_;
              local_568._0_4_ = auVar169._0_4_ * 1.9073486e-06;
              local_368 = fVar69 * 1.9073486e-06;
              fStack_394 = local_398;
              fStack_390 = local_398;
              fStack_38c = local_398;
              lVar48 = 4;
              do {
                fVar69 = 1.0 - fVar127;
                fVar128 = local_468 * fVar69 + local_478 * fVar127;
                fVar141 = fStack_464 * fVar69 + fStack_474 * fVar127;
                fVar143 = fStack_460 * fVar69 + fStack_470 * fVar127;
                fVar155 = fStack_45c * fVar69 + fStack_46c * fVar127;
                fVar108 = (local_4f8 * fVar69 + local_468 * fVar127) * fVar69 + fVar127 * fVar128;
                fVar109 = (fStack_4f4 * fVar69 + fStack_464 * fVar127) * fVar69 + fVar127 * fVar141;
                fVar110 = (fStack_4f0 * fVar69 + fStack_460 * fVar127) * fVar69 + fVar127 * fVar143;
                fVar126 = (fStack_4ec * fVar69 + fStack_45c * fVar127) * fVar69 + fVar127 * fVar155;
                fVar140 = fVar128 * fVar69 + (local_478 * fVar69 + local_488 * fVar127) * fVar127;
                fVar141 = fVar141 * fVar69 + (fStack_474 * fVar69 + fStack_484 * fVar127) * fVar127;
                fVar143 = fVar143 * fVar69 + (fStack_470 * fVar69 + fStack_480 * fVar127) * fVar127;
                fVar155 = fVar155 * fVar69 + (fStack_46c * fVar69 + fStack_47c * fVar127) * fVar127;
                fVar128 = auVar224._0_4_;
                local_348._0_4_ = fVar69 * fVar108 + fVar127 * fVar140;
                local_348._4_4_ = fVar69 * fVar109 + fVar127 * fVar141;
                fStack_340 = fVar69 * fVar110 + fVar127 * fVar143;
                fStack_33c = fVar69 * fVar126 + fVar127 * fVar155;
                fVar140 = (fVar140 - fVar108) * 3.0;
                fVar141 = (fVar141 - fVar109) * 3.0;
                fVar143 = (fVar143 - fVar110) * 3.0;
                fVar126 = (fVar155 - fVar126) * 3.0;
                local_548 = (fVar128 * local_558 + 0.0) - (float)local_348._0_4_;
                fStack_544 = (fVar128 * fStack_554 + 0.0) - (float)local_348._4_4_;
                fStack_540 = (fVar128 * fStack_550 + 0.0) - fStack_340;
                fStack_53c = (fVar128 * fStack_54c + 0.0) - fStack_33c;
                fVar108 = fStack_544 * fStack_544;
                fVar109 = fStack_540 * fStack_540;
                fVar110 = fStack_53c * fStack_53c;
                auVar252._0_4_ = fVar108 + local_548 * local_548 + fVar109;
                auVar252._4_4_ = fVar108 + fVar108 + fVar110;
                auVar252._8_4_ = fVar108 + fVar109 + fVar109;
                auVar252._12_4_ = fVar108 + fVar110 + fVar110;
                local_358 = auVar252._0_4_;
                if (auVar252._0_4_ < 0.0) {
                  local_588 = ZEXT416((uint)fVar69);
                  fVar108 = sqrtf(auVar252._0_4_);
                  pRVar51 = extraout_RAX_04;
                  fVar69 = (float)local_588._0_4_;
                }
                else {
                  fVar108 = SQRT(auVar252._0_4_);
                  pRVar51 = pRVar50;
                }
                fVar155 = fVar69 * 6.0;
                fVar109 = (fVar127 - (fVar69 + fVar69)) * 6.0;
                fVar110 = (fVar69 - (fVar127 + fVar127)) * 6.0;
                fVar69 = fVar127 * 6.0;
                fVar156 = fVar155 * local_4f8 +
                          fVar109 * local_468 + fVar110 * local_478 + fVar69 * local_488;
                fVar157 = fVar155 * fStack_4f4 +
                          fVar109 * fStack_464 + fVar110 * fStack_474 + fVar69 * fStack_484;
                fVar176 = fVar155 * fStack_4f0 +
                          fVar109 * fStack_460 + fVar110 * fStack_470 + fVar69 * fStack_480;
                local_4b8 = (float)local_568._0_4_;
                if ((float)local_568._0_4_ <= local_368 * fVar128) {
                  local_4b8 = local_368 * fVar128;
                }
                fVar177 = fVar141 * fVar141 + fVar140 * fVar140 + fVar143 * fVar143;
                auVar245 = ZEXT416((uint)fVar177);
                auVar79 = rsqrtss(ZEXT416((uint)fVar177),auVar245);
                fVar178 = auVar79._0_4_;
                fVar178 = fVar178 * fVar178 * fVar177 * -0.5 * fVar178 + fVar178 * 1.5;
                fVar129 = fVar143 * fVar176 + fVar141 * fVar157 + fVar140 * fVar156;
                auVar79 = rcpss(auVar245,auVar245);
                fVar188 = (2.0 - fVar177 * auVar79._0_4_) * auVar79._0_4_;
                local_528 = fVar188 * (fVar177 * fVar156 - fVar129 * fVar140) * fVar178;
                fStack_524 = fVar188 * (fVar177 * fVar157 - fVar129 * fVar141) * fVar178;
                fStack_520 = fVar188 * (fVar177 * fVar176 - fVar129 * fVar143) * fVar178;
                fStack_51c = fVar188 * (fVar177 * (fVar155 * fStack_4ec +
                                                  fVar109 * fStack_45c +
                                                  fVar110 * fStack_46c + fVar69 * fStack_47c) -
                                       fVar129 * fVar126) * fVar178;
                fStack_4b4 = (float)local_568._4_4_;
                fStack_4b0 = fStack_560;
                fStack_4ac = fStack_55c;
                if (fVar177 < 0.0) {
                  local_588._0_4_ = fVar108;
                  local_518 = fVar140 * fVar178;
                  fStack_514 = fVar141 * fVar178;
                  fStack_510 = fVar143 * fVar178;
                  fStack_50c = fVar126 * fVar178;
                  local_508 = -fVar140;
                  fStack_504 = -fVar141;
                  fStack_500 = -fVar143;
                  fStack_4fc = -fVar126;
                  fVar177 = sqrtf(fVar177);
                  pRVar51 = extraout_RAX_05;
                  fVar69 = local_518;
                  fVar110 = fStack_514;
                  fVar155 = fStack_510;
                  fVar109 = fStack_50c;
                  fVar156 = local_508;
                  fVar157 = fStack_504;
                  fVar176 = fStack_500;
                  fVar178 = fStack_4fc;
                  fVar108 = (float)local_588._0_4_;
                }
                else {
                  fVar177 = SQRT(fVar177);
                  fVar69 = fVar140 * fVar178;
                  fVar110 = fVar141 * fVar178;
                  fVar155 = fVar143 * fVar178;
                  fVar109 = fVar126 * fVar178;
                  fVar156 = -fVar140;
                  fVar157 = -fVar141;
                  fVar176 = -fVar143;
                  fVar178 = -fVar126;
                }
                fVar129 = fStack_544 * fVar110;
                fVar142 = fStack_540 * fVar155;
                fVar190 = fStack_53c * fVar109;
                fVar188 = fVar129 + local_548 * fVar69 + fVar142;
                fVar197 = fVar129 + fVar129 + fVar190;
                fVar142 = fVar129 + fVar142 + fVar142;
                fVar190 = fVar129 + fVar190 + fVar190;
                fVar129 = (fVar108 + 1.0) * ((float)local_568._0_4_ / fVar177) +
                          fVar108 * (float)local_568._0_4_ + local_4b8;
                fVar177 = fStack_54c * fVar109;
                fVar109 = fVar109 * fVar178;
                fVar108 = fVar155 * fVar176 + fVar110 * fVar157 + fVar69 * fVar156 +
                          fStack_520 * fStack_540 + fStack_524 * fStack_544 + local_528 * local_548;
                fVar69 = fStack_550 * fVar155 + fStack_554 * fVar110 + local_558 * fVar69;
                fVar189 = auVar252._0_4_ - fVar188 * fVar188;
                auVar104._0_8_ = CONCAT44(auVar252._4_4_ - fVar197 * fVar197,fVar189);
                auVar104._8_4_ = auVar252._8_4_ - fVar142 * fVar142;
                auVar104._12_4_ = auVar252._12_4_ - fVar190 * fVar190;
                fVar178 = fVar178 * fStack_53c;
                fVar110 = (fVar176 * fStack_540 + fVar157 * fStack_544 + fVar156 * local_548) -
                          fVar188 * fVar108;
                fStack_520 = fStack_550 * fStack_540;
                fStack_524 = fStack_54c * fStack_53c;
                local_528 = (fStack_520 + fStack_554 * fStack_544 + local_558 * local_548) -
                            fVar188 * fVar69;
                auVar152._8_4_ = auVar104._8_4_;
                auVar152._0_8_ = auVar104._0_8_;
                auVar152._12_4_ = auVar104._12_4_;
                auVar79 = rsqrtss(auVar152,auVar104);
                fVar156 = auVar79._0_4_;
                auVar153._4_12_ = auVar79._4_12_;
                auVar153._0_4_ = fVar156 * fVar156 * fVar189 * -0.5 * fVar156 + fVar156 * 1.5;
                fStack_51c = fStack_524;
                if (fVar189 < 0.0) {
                  local_588._0_4_ = fVar129;
                  _local_538 = auVar153;
                  local_518 = fVar108;
                  fStack_514 = fVar109;
                  fStack_510 = fVar155 * fVar176;
                  fStack_50c = fVar109;
                  local_508 = fVar110;
                  fStack_504 = fVar178;
                  fStack_500 = fVar176 * fStack_540;
                  fStack_4fc = fVar178;
                  local_388 = fVar69;
                  fStack_384 = fVar177;
                  fStack_380 = fStack_550 * fVar155;
                  fStack_37c = fVar177;
                  local_378 = fVar188;
                  fStack_374 = fVar197;
                  fStack_370 = fVar142;
                  fStack_36c = fVar190;
                  fVar189 = sqrtf(fVar189);
                  pRVar51 = extraout_RAX_06;
                  auVar153 = _local_538;
                  fVar108 = local_518;
                  fVar109 = fStack_514;
                  fVar69 = local_388;
                  fVar177 = fStack_384;
                  fVar110 = local_508;
                  fVar178 = fStack_504;
                  fVar129 = (float)local_588._0_4_;
                  fVar188 = local_378;
                }
                else {
                  fVar189 = SQRT(fVar189);
                }
                fVar189 = fVar189 - fStack_33c;
                fVar110 = fVar110 * auVar153._0_4_ - fVar126;
                auVar18._4_4_ = fStack_524;
                auVar18._0_4_ = local_528;
                auVar18._8_4_ = fStack_520;
                auVar18._12_4_ = fStack_51c;
                auVar133._4_12_ = auVar18._4_12_;
                auVar133._0_4_ = local_528 * auVar153._0_4_;
                auVar239._0_8_ = CONCAT44(fVar178,fVar110) ^ 0x8000000080000000;
                auVar239._8_4_ = -fVar178;
                auVar239._12_4_ = fVar109;
                auVar238._8_8_ = auVar239._8_8_;
                auVar238._0_8_ = CONCAT44(fVar108,fVar110) ^ 0x80000000;
                fVar108 = fVar108 * auVar133._0_4_ - fVar69 * fVar110;
                auVar135._0_8_ = auVar133._0_8_;
                auVar135._8_4_ = fStack_524;
                auVar135._12_4_ = -fVar177;
                auVar134._8_8_ = auVar135._8_8_;
                auVar134._0_8_ = CONCAT44(fVar69,auVar133._0_4_) ^ 0x8000000000000000;
                auVar14._4_4_ = fVar108;
                auVar14._0_4_ = fVar108;
                auVar14._8_4_ = fVar108;
                auVar14._12_4_ = fVar108;
                auVar79 = divps(auVar134,auVar14);
                auVar15._4_4_ = fVar108;
                auVar15._0_4_ = fVar108;
                auVar15._8_4_ = fVar108;
                auVar15._12_4_ = fVar108;
                auVar245 = divps(auVar238,auVar15);
                fVar127 = fVar127 - (auVar79._4_4_ * fVar189 + auVar79._0_4_ * fVar188);
                auVar224._0_4_ = fVar128 - (auVar245._4_4_ * fVar189 + auVar245._0_4_ * fVar188);
                if (fVar129 <= ABS(fVar188)) {
                  bVar8 = false;
                }
                else if (local_398 * 1.9073486e-06 + local_4b8 + fVar129 <= ABS(fVar189)) {
                  bVar8 = false;
                }
                else {
                  auVar224._0_4_ = auVar224._0_4_ + (float)local_2c8._0_4_;
                  bVar8 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= auVar224._0_4_) &&
                       (fVar69 = (ray->super_RayK<1>).tfar, auVar224._0_4_ <= fVar69)) &&
                      (0.0 <= fVar127)) && (fVar127 <= 1.0)) {
                    auVar79 = rsqrtss(auVar252,auVar252);
                    fVar108 = auVar79._0_4_;
                    pGVar6 = (context->scene->geometries).items[(long)local_570].ptr;
                    uVar61 = (ray->super_RayK<1>).mask;
                    pRVar51 = (RayHit *)(ulong)uVar61;
                    pRVar53 = local_570;
                    if ((pGVar6->mask & uVar61) != 0) {
                      fVar108 = fVar108 * 1.5 + fVar108 * fVar108 * local_358 * -0.5 * fVar108;
                      fVar128 = local_548 * fVar108;
                      fVar156 = fStack_544 * fVar108;
                      fVar108 = fStack_540 * fVar108;
                      fVar110 = fVar126 * fVar128 + fVar140;
                      fVar109 = fVar126 * fVar156 + fVar141;
                      fVar126 = fVar126 * fVar108 + fVar143;
                      fVar155 = fVar156 * fVar140 - fVar141 * fVar128;
                      fVar141 = fVar108 * fVar141 - fVar143 * fVar156;
                      fVar128 = fVar128 * fVar143 - fVar140 * fVar108;
                      fVar108 = fVar109 * fVar141 - fVar128 * fVar110;
                      fVar109 = fVar126 * fVar128 - fVar155 * fVar109;
                      fVar110 = fVar110 * fVar155 - fVar141 * fVar126;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = auVar224._0_4_;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar110,fVar109);
                        (ray->Ng).field_0.field_0.z = fVar108;
                        ray->u = fVar127;
                        ray->v = 0.0;
                        ray->primID = uVar59;
                        ray->geomID = (uint)local_570;
                        ray->instID[0] = context->user->instID[0];
                        uVar61 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar61;
                        pRVar51 = (RayHit *)(ulong)uVar61;
                      }
                      else {
                        local_458 = CONCAT44(fVar110,fVar109);
                        fStack_450 = fVar108;
                        fStack_44c = fVar127;
                        local_448 = 0;
                        local_444 = uVar59;
                        local_440 = (uint)local_570;
                        local_43c = context->user->instID[0];
                        pRVar53 = (RTCIntersectArguments *)(ulong)local_43c;
                        local_438 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = auVar224._0_4_;
                        local_58c = 0xffffffff;
                        local_4e8.geometryUserPtr = pGVar6->userPtr;
                        local_4e8.valid = &local_58c;
                        local_4e8.context = context->user;
                        local_4e8.hit = (RTCHitN *)&local_458;
                        local_4e8.N = 1;
                        local_4e8.ray = (RTCRayN *)ray;
                        if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00afad40:
                          pRVar53 = context->args;
                          if (pRVar53->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar53->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar53->filter)(&local_4e8);
                            }
                            if ((((RayK<1> *)local_4e8.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00afade8;
                          }
                          (((Vec3f *)((long)local_4e8.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_4e8.hit;
                          (((Vec3f *)((long)local_4e8.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_4e8.hit + 4);
                          (((Vec3f *)((long)local_4e8.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_4e8.hit + 8);
                          *(float *)((long)local_4e8.ray + 0x3c) = *(float *)(local_4e8.hit + 0xc);
                          *(float *)((long)local_4e8.ray + 0x40) = *(float *)(local_4e8.hit + 0x10);
                          *(float *)((long)local_4e8.ray + 0x44) = *(float *)(local_4e8.hit + 0x14);
                          *(float *)((long)local_4e8.ray + 0x48) = *(float *)(local_4e8.hit + 0x18);
                          *(float *)((long)local_4e8.ray + 0x4c) = *(float *)(local_4e8.hit + 0x1c);
                          pRVar53 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_4e8.hit + 0x20);
                          *(float *)((long)local_4e8.ray + 0x50) = *(float *)(local_4e8.hit + 0x20);
                          pRVar51 = (RayHit *)local_4e8.ray;
                        }
                        else {
                          (*pGVar6->intersectionFilterN)(&local_4e8);
                          if ((((RayK<1> *)local_4e8.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00afad40;
LAB_00afade8:
                          (ray->super_RayK<1>).tfar = fVar69;
                          pRVar51 = (RayHit *)local_4e8.valid;
                        }
                      }
                    }
                  }
                }
                bVar58 = lVar48 == 0;
                lVar48 = lVar48 + -1;
                pRVar50 = (RayHit *)CONCAT71((int7)((ulong)pRVar51 >> 8),bVar58);
              } while ((!bVar8) && (!bVar58));
              fVar127 = (ray->super_RayK<1>).tfar;
              local_308._0_4_ = -(uint)(local_3c8 <= fVar127) & local_308._0_4_;
              local_308._4_4_ = -(uint)(fStack_3c4 <= fVar127) & local_308._4_4_;
              local_308._8_4_ = -(uint)(fStack_3c0 <= fVar127) & local_308._8_4_;
              local_308._12_4_ = -(uint)(fStack_3bc <= fVar127) & local_308._12_4_;
              uVar52 = (undefined4)((ulong)pRVar51 >> 0x20);
              iVar46 = movmskps((int)pRVar50,local_308);
            } while (iVar46 != 0);
          }
          fVar127 = (ray->super_RayK<1>).tfar;
          auVar170._0_4_ =
               local_498._0_4_ & local_328._0_4_ &
               -(uint)(local_3a8 + (float)local_118._0_4_ <= fVar127);
          auVar170._4_4_ =
               local_498._4_4_ & local_328._4_4_ &
               -(uint)(fStack_3a4 + (float)local_118._4_4_ <= fVar127);
          auVar170._8_4_ =
               (uint)fStack_490 & (uint)fStack_320 & -(uint)(fStack_3a0 + fStack_110 <= fVar127);
          auVar170._12_4_ =
               (uint)fStack_48c & (uint)fStack_31c & -(uint)(fStack_39c + fStack_10c <= fVar127);
          auVar136._0_4_ =
               local_408._0_4_ & local_418._0_4_ &
               -(uint)(local_3a8 + (float)local_258._0_4_ <= fVar127);
          auVar136._4_4_ =
               local_408._4_4_ & local_418._4_4_ &
               -(uint)(fStack_3a4 + (float)local_258._4_4_ <= fVar127);
          auVar136._8_4_ =
               (uint)fStack_400 & (uint)fStack_410 & -(uint)(fStack_3a0 + fStack_250 <= fVar127);
          auVar136._12_4_ =
               (uint)fStack_3fc & (uint)fStack_40c & -(uint)(fStack_39c + fStack_24c <= fVar127);
          iVar46 = movmskps(iVar46,auVar136 | auVar170);
          if (iVar46 != 0) {
            *(undefined1 (*) [16])(auStack_f8 + uVar56 * 0xc) = auVar136 | auVar170;
            auVar105._0_4_ = local_118._0_4_ & auVar170._0_4_;
            auVar105._4_4_ = local_118._4_4_ & auVar170._4_4_;
            auVar105._8_4_ = (uint)fStack_110 & auVar170._8_4_;
            auVar105._12_4_ = (uint)fStack_10c & auVar170._12_4_;
            auVar171._0_4_ = ~auVar170._0_4_ & local_258._0_4_;
            auVar171._4_4_ = ~auVar170._4_4_ & local_258._4_4_;
            auVar171._8_4_ = ~auVar170._8_4_ & (uint)fStack_250;
            auVar171._12_4_ = ~auVar170._12_4_ & (uint)fStack_24c;
            *(undefined1 (*) [16])(afStack_e8 + uVar56 * 0xc) = auVar171 | auVar105;
            afStack_d0[uVar56 * 0xc + -2] = local_3f8;
            afStack_d0[uVar56 * 0xc + -1] = fStack_3f4;
            fVar127 = (float)((int)local_4a0 + 1);
            pRVar53 = (RTCIntersectArguments *)(ulong)(uint)fVar127;
            afStack_d0[uVar56 * 0xc] = fVar127;
            uVar49 = (ulong)((int)uVar56 + 1);
          }
        }
      }
    }
    fVar127 = (ray->super_RayK<1>).tfar;
    do {
      uVar61 = (uint)uVar49;
      if (uVar61 == 0) {
        fVar127 = (ray->super_RayK<1>).tfar;
        auVar125._4_4_ = -(uint)(fStack_234 <= fVar127);
        auVar125._0_4_ = -(uint)(local_238 <= fVar127);
        auVar125._8_4_ = -(uint)(fStack_230 <= fVar127);
        auVar125._12_4_ = -(uint)(fStack_22c <= fVar127);
        uVar59 = movmskps(0,auVar125);
        uVar59 = (uint)local_290 & uVar59;
        if (uVar59 == 0) {
          return;
        }
        goto LAB_00af88d0;
      }
      uVar49 = (ulong)(uVar61 - 1);
      local_4e8.valid._0_4_ =
           -(uint)(local_3a8 + afStack_e8[uVar49 * 0xc] <= fVar127) & auStack_f8[uVar49 * 0xc];
      local_4e8.valid._4_4_ =
           -(uint)(fStack_3a4 + afStack_e8[uVar49 * 0xc + 1] <= fVar127) &
           auStack_f8[uVar49 * 0xc + 1];
      local_4e8.geometryUserPtr._0_4_ =
           -(uint)(fStack_3a0 + afStack_e8[uVar49 * 0xc + 2] <= fVar127) &
           auStack_f8[uVar49 * 0xc + 2];
      local_4e8.geometryUserPtr._4_4_ =
           -(uint)(fStack_39c + afStack_e8[uVar49 * 0xc + 3] <= fVar127) &
           (uint)afStack_e8[uVar49 * 0xc + -1];
      uVar63 = movmskps((int)pRVar53,(undefined1  [16])local_4e8._0_16_);
      pRVar53 = (RTCIntersectArguments *)(ulong)uVar63;
      if (uVar63 != 0) {
        auVar137._0_4_ = (uint)afStack_e8[uVar49 * 0xc] & (uint)local_4e8.valid;
        auVar137._4_4_ = (uint)afStack_e8[uVar49 * 0xc + 1] & local_4e8.valid._4_4_;
        auVar137._8_4_ = (uint)afStack_e8[uVar49 * 0xc + 2] & (uint)local_4e8.geometryUserPtr;
        auVar137._12_4_ = (uint)afStack_e8[uVar49 * 0xc + 3] & local_4e8.geometryUserPtr._4_4_;
        auVar154._0_8_ =
             CONCAT44(~local_4e8.valid._4_4_,~(uint)local_4e8.valid) & 0x7f8000007f800000;
        auVar154._8_4_ = ~(uint)local_4e8.geometryUserPtr & 0x7f800000;
        auVar154._12_4_ = ~local_4e8.geometryUserPtr._4_4_ & 0x7f800000;
        auVar154 = auVar154 | auVar137;
        auVar172._4_4_ = auVar154._0_4_;
        auVar172._0_4_ = auVar154._4_4_;
        auVar172._8_4_ = auVar154._12_4_;
        auVar172._12_4_ = auVar154._8_4_;
        auVar79 = minps(auVar172,auVar154);
        auVar138._0_8_ = auVar79._8_8_;
        auVar138._8_4_ = auVar79._0_4_;
        auVar138._12_4_ = auVar79._4_4_;
        auVar79 = minps(auVar138,auVar79);
        auVar139._0_8_ =
             CONCAT44(-(uint)(auVar79._4_4_ == auVar154._4_4_) & local_4e8.valid._4_4_,
                      -(uint)(auVar79._0_4_ == auVar154._0_4_) & (uint)local_4e8.valid);
        auVar139._8_4_ = -(uint)(auVar79._8_4_ == auVar154._8_4_) & (uint)local_4e8.geometryUserPtr;
        auVar139._12_4_ =
             -(uint)(auVar79._12_4_ == auVar154._12_4_) & local_4e8.geometryUserPtr._4_4_;
        iVar46 = movmskps((int)pRVar55,auVar139);
        auVar124 = (undefined1  [16])local_4e8._0_16_;
        if (iVar46 != 0) {
          auVar124._8_4_ = auVar139._8_4_;
          auVar124._0_8_ = auVar139._0_8_;
          auVar124._12_4_ = auVar139._12_4_;
        }
        fVar69 = afStack_d0[uVar49 * 0xc + -2];
        fVar108 = afStack_d0[uVar49 * 0xc + -1];
        local_4a0 = (ulong)(uint)afStack_d0[uVar49 * 0xc];
        uVar65 = movmskps(afStack_d0[uVar49 * 0xc],auVar124);
        pRVar55 = (RTCIntersectArguments *)0x0;
        if (uVar65 != 0) {
          for (; (uVar65 >> (long)pRVar55 & 1) == 0;
              pRVar55 = (RTCIntersectArguments *)((long)&pRVar55->flags + 1)) {
          }
        }
        *(undefined4 *)((long)&local_4e8.valid + (long)pRVar55 * 4) = 0;
        *(undefined1 (*) [16])(auStack_f8 + uVar49 * 0xc) = (undefined1  [16])local_4e8._0_16_;
        iVar46 = movmskps((int)(undefined1 (*) [16])(auStack_f8 + uVar49 * 0xc),
                          (undefined1  [16])local_4e8._0_16_);
        if (iVar46 == 0) {
          uVar61 = uVar61 - 1;
        }
        fVar108 = fVar108 - fVar69;
        local_458 = CONCAT44(fVar108 * 0.33333334 + fVar69,fVar108 * 0.0 + fVar69);
        fStack_450 = fVar108 * 0.6666667 + fVar69;
        fStack_44c = fVar108 * 1.0 + fVar69;
        local_3f8 = *(float *)((long)&local_458 + (long)pRVar55 * 4);
        fStack_3f4 = *(float *)((long)&local_458 + (long)pRVar55 * 4 + 4);
        uStack_3f0 = 0;
        uStack_3ec = 0;
        uVar49 = (ulong)uVar61;
      }
      uVar56 = uVar49;
    } while ((char)uVar63 == '\0');
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }